

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  uint uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  undefined4 uVar90;
  undefined8 unaff_R13;
  bool bVar91;
  __m128 a;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar92 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar105 [32];
  float fVar114;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar93 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar98 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 ai;
  undefined1 auVar118 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar141;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar142;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar143;
  float fVar165;
  float fVar166;
  vint4 bi_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar167;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar153 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar190;
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar191;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [28];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar210;
  float fVar229;
  float fVar231;
  vint4 ai_1;
  undefined1 auVar211 [16];
  float fVar232;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  float fVar230;
  float fVar235;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar233;
  float fVar234;
  undefined1 auVar228 [64];
  float fVar236;
  float fVar245;
  float fVar248;
  vint4 bi_1;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar246;
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar242 [28];
  undefined1 auVar243 [32];
  float fVar254;
  float fVar257;
  undefined1 auVar244 [64];
  float fVar263;
  float fVar264;
  float fVar269;
  float fVar271;
  vint4 ai_2;
  undefined1 auVar265 [16];
  float fVar273;
  undefined1 auVar266 [16];
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar267 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar268 [64];
  float fVar278;
  float fVar289;
  float fVar293;
  undefined1 auVar282 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar315;
  float fVar321;
  float fVar322;
  undefined1 auVar316 [16];
  float fVar323;
  undefined1 auVar317 [16];
  float fVar324;
  float fVar325;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [64];
  float fVar326;
  float fVar331;
  float fVar332;
  undefined1 auVar327 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar338;
  float fVar339;
  float fVar346;
  float fVar348;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar353;
  float fVar355;
  float fVar357;
  float fVar358;
  undefined1 auVar344 [32];
  float fVar352;
  float fVar354;
  float fVar356;
  undefined1 auVar345 [64];
  float fVar359;
  float fVar364;
  float fVar365;
  undefined1 auVar360 [16];
  float fVar367;
  float fVar368;
  float fVar369;
  undefined1 auVar361 [32];
  float fVar366;
  undefined1 auVar362 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar374 [32];
  undefined1 auVar381 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b1c;
  float local_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a18;
  int local_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined8 local_950;
  float local_948;
  float local_944;
  undefined4 local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [16];
  Primitive *local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar363 [64];
  
  PVar11 = prim[1];
  uVar82 = (ulong)(byte)PVar11;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  lVar89 = uVar82 * 0x25;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x11 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1a + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1b + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1c + 6)));
  fVar315 = *(float *)(prim + lVar89 + 0x12);
  auVar150 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar89 + 6));
  auVar192._0_4_ = fVar315 * auVar150._0_4_;
  auVar192._4_4_ = fVar315 * auVar150._4_4_;
  auVar192._8_4_ = fVar315 * auVar150._8_4_;
  auVar192._12_4_ = fVar315 * auVar150._12_4_;
  auVar340._0_4_ = fVar315 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar340._4_4_ = fVar315 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar340._8_4_ = fVar315 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar340._12_4_ = fVar315 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar150 = vcvtdq2ps_avx(auVar176);
  auVar18 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar176 = vshufps_avx(auVar340,auVar340,0x55);
  auVar20 = vshufps_avx(auVar340,auVar340,0xaa);
  fVar263 = auVar20._0_4_;
  fVar269 = auVar20._4_4_;
  fVar271 = auVar20._8_4_;
  fVar273 = auVar20._12_4_;
  fVar191 = auVar176._0_4_;
  fVar142 = auVar176._4_4_;
  fVar210 = auVar176._8_4_;
  fVar230 = auVar176._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar104);
  auVar101 = vcvtdq2ps_avx(auVar173);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar104 = vshufps_avx(auVar340,auVar340,0);
  fVar315 = auVar104._0_4_;
  fVar321 = auVar104._4_4_;
  fVar322 = auVar104._8_4_;
  fVar323 = auVar104._12_4_;
  auVar265._0_4_ = auVar96._0_4_ * fVar315 + fVar191 * auVar150._0_4_ + fVar263 * auVar18._0_4_;
  auVar265._4_4_ = auVar96._4_4_ * fVar321 + fVar142 * auVar150._4_4_ + fVar269 * auVar18._4_4_;
  auVar265._8_4_ = auVar96._8_4_ * fVar322 + fVar210 * auVar150._8_4_ + fVar271 * auVar18._8_4_;
  auVar265._12_4_ = auVar96._12_4_ * fVar323 + fVar230 * auVar150._12_4_ + fVar273 * auVar18._12_4_;
  auVar144._0_4_ = fVar315 * auVar101._0_4_ + fVar191 * auVar21._0_4_ + auVar22._0_4_ * fVar263;
  auVar144._4_4_ = fVar321 * auVar101._4_4_ + fVar142 * auVar21._4_4_ + auVar22._4_4_ * fVar269;
  auVar144._8_4_ = fVar322 * auVar101._8_4_ + fVar210 * auVar21._8_4_ + auVar22._8_4_ * fVar271;
  auVar144._12_4_ = fVar323 * auVar101._12_4_ + fVar230 * auVar21._12_4_ + auVar22._12_4_ * fVar273;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar98 = vpmovsxwd_avx(auVar104);
  auVar104 = vcvtdq2ps_avx(auVar126);
  auVar316._0_4_ = fVar191 * auVar95._0_4_ + fVar263 * auVar100._0_4_ + auVar104._0_4_ * fVar315;
  auVar316._4_4_ = fVar142 * auVar95._4_4_ + fVar269 * auVar100._4_4_ + auVar104._4_4_ * fVar321;
  auVar316._8_4_ = fVar210 * auVar95._8_4_ + fVar271 * auVar100._8_4_ + auVar104._8_4_ * fVar322;
  auVar316._12_4_ = fVar230 * auVar95._12_4_ + fVar273 * auVar100._12_4_ + auVar104._12_4_ * fVar323
  ;
  auVar176 = vshufps_avx(auVar192,auVar192,0xaa);
  fVar263 = auVar176._0_4_;
  fVar269 = auVar176._4_4_;
  fVar271 = auVar176._8_4_;
  fVar273 = auVar176._12_4_;
  auVar176 = vshufps_avx(auVar192,auVar192,0x55);
  fVar191 = auVar176._0_4_;
  fVar142 = auVar176._4_4_;
  fVar210 = auVar176._8_4_;
  fVar230 = auVar176._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar126 = vpmovsxwd_avx(auVar176);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar103 = vpmovsxwd_avx(auVar20);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar82 * 0xd + 6);
  auVar173 = vpmovsxwd_avx(auVar173);
  auVar176 = vshufps_avx(auVar192,auVar192,0);
  fVar315 = auVar176._0_4_;
  fVar321 = auVar176._4_4_;
  fVar322 = auVar176._8_4_;
  fVar323 = auVar176._12_4_;
  auVar282._0_4_ = fVar191 * auVar150._0_4_ + fVar263 * auVar18._0_4_ + auVar96._0_4_ * fVar315;
  auVar282._4_4_ = fVar142 * auVar150._4_4_ + fVar269 * auVar18._4_4_ + auVar96._4_4_ * fVar321;
  auVar282._8_4_ = fVar210 * auVar150._8_4_ + fVar271 * auVar18._8_4_ + auVar96._8_4_ * fVar322;
  auVar282._12_4_ = fVar230 * auVar150._12_4_ + fVar273 * auVar18._12_4_ + auVar96._12_4_ * fVar323;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar82 * 0x12 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar237._0_4_ = fVar191 * auVar21._0_4_ + auVar22._0_4_ * fVar263 + fVar315 * auVar101._0_4_;
  auVar237._4_4_ = fVar142 * auVar21._4_4_ + auVar22._4_4_ * fVar269 + fVar321 * auVar101._4_4_;
  auVar237._8_4_ = fVar210 * auVar21._8_4_ + auVar22._8_4_ * fVar271 + fVar322 * auVar101._8_4_;
  auVar237._12_4_ = fVar230 * auVar21._12_4_ + auVar22._12_4_ * fVar273 + fVar323 * auVar101._12_4_;
  auVar193._0_4_ = auVar104._0_4_ * fVar315 + fVar263 * auVar100._0_4_ + fVar191 * auVar95._0_4_;
  auVar193._4_4_ = auVar104._4_4_ * fVar321 + fVar269 * auVar100._4_4_ + fVar142 * auVar95._4_4_;
  auVar193._8_4_ = auVar104._8_4_ * fVar322 + fVar271 * auVar100._8_4_ + fVar210 * auVar95._8_4_;
  auVar193._12_4_ = auVar104._12_4_ * fVar323 + fVar273 * auVar100._12_4_ + fVar230 * auVar95._12_4_
  ;
  auVar341._8_4_ = 0x7fffffff;
  auVar341._0_8_ = 0x7fffffff7fffffff;
  auVar341._12_4_ = 0x7fffffff;
  auVar104 = vandps_avx(auVar341,auVar265);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  auVar104 = vcmpps_avx(auVar104,auVar211,1);
  auVar176 = vblendvps_avx(auVar265,auVar211,auVar104);
  auVar104 = vandps_avx(auVar341,auVar144);
  auVar104 = vcmpps_avx(auVar104,auVar211,1);
  auVar20 = vblendvps_avx(auVar144,auVar211,auVar104);
  auVar104 = vandps_avx(auVar316,auVar341);
  auVar104 = vcmpps_avx(auVar104,auVar211,1);
  auVar104 = vblendvps_avx(auVar316,auVar211,auVar104);
  auVar18 = vrcpps_avx(auVar176);
  fVar209 = auVar18._0_4_;
  auVar118._0_4_ = fVar209 * auVar176._0_4_;
  fVar229 = auVar18._4_4_;
  auVar118._4_4_ = fVar229 * auVar176._4_4_;
  fVar231 = auVar18._8_4_;
  auVar118._8_4_ = fVar231 * auVar176._8_4_;
  fVar232 = auVar18._12_4_;
  auVar118._12_4_ = fVar232 * auVar176._12_4_;
  auVar342._8_4_ = 0x3f800000;
  auVar342._0_8_ = 0x3f8000003f800000;
  auVar342._12_4_ = 0x3f800000;
  auVar176 = vsubps_avx(auVar342,auVar118);
  fVar209 = fVar209 + fVar209 * auVar176._0_4_;
  fVar229 = fVar229 + fVar229 * auVar176._4_4_;
  fVar231 = fVar231 + fVar231 * auVar176._8_4_;
  fVar232 = fVar232 + fVar232 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar20);
  fVar263 = auVar176._0_4_;
  auVar145._0_4_ = fVar263 * auVar20._0_4_;
  fVar269 = auVar176._4_4_;
  auVar145._4_4_ = fVar269 * auVar20._4_4_;
  fVar271 = auVar176._8_4_;
  auVar145._8_4_ = fVar271 * auVar20._8_4_;
  fVar273 = auVar176._12_4_;
  auVar145._12_4_ = fVar273 * auVar20._12_4_;
  auVar176 = vsubps_avx(auVar342,auVar145);
  fVar263 = fVar263 + fVar263 * auVar176._0_4_;
  fVar269 = fVar269 + fVar269 * auVar176._4_4_;
  fVar271 = fVar271 + fVar271 * auVar176._8_4_;
  fVar273 = fVar273 + fVar273 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar104);
  fVar315 = auVar176._0_4_;
  auVar146._0_4_ = auVar104._0_4_ * fVar315;
  fVar321 = auVar176._4_4_;
  auVar146._4_4_ = auVar104._4_4_ * fVar321;
  fVar322 = auVar176._8_4_;
  auVar146._8_4_ = auVar104._8_4_ * fVar322;
  fVar323 = auVar176._12_4_;
  auVar146._12_4_ = auVar104._12_4_ * fVar323;
  auVar104 = vsubps_avx(auVar342,auVar146);
  fVar315 = fVar315 + fVar315 * auVar104._0_4_;
  fVar321 = fVar321 + fVar321 * auVar104._4_4_;
  fVar322 = fVar322 + fVar322 * auVar104._8_4_;
  fVar323 = fVar323 + fVar323 * auVar104._12_4_;
  auVar20 = vpermilps_avx(ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                                         *(float *)(prim + lVar89 + 0x16)) *
                                        *(float *)(prim + lVar89 + 0x1a))),0);
  auVar104 = vcvtdq2ps_avx(auVar98);
  auVar176 = vcvtdq2ps_avx(auVar126);
  auVar176 = vsubps_avx(auVar176,auVar104);
  fVar191 = auVar20._0_4_;
  fVar142 = auVar20._4_4_;
  fVar210 = auVar20._8_4_;
  fVar230 = auVar20._12_4_;
  auVar126._0_4_ = fVar191 * auVar176._0_4_ + auVar104._0_4_;
  auVar126._4_4_ = fVar142 * auVar176._4_4_ + auVar104._4_4_;
  auVar126._8_4_ = fVar210 * auVar176._8_4_ + auVar104._8_4_;
  auVar126._12_4_ = fVar230 * auVar176._12_4_ + auVar104._12_4_;
  auVar104 = vcvtdq2ps_avx(auVar103);
  auVar176 = vcvtdq2ps_avx(auVar173);
  auVar176 = vsubps_avx(auVar176,auVar104);
  auVar168._0_4_ = auVar176._0_4_ * fVar191 + auVar104._0_4_;
  auVar168._4_4_ = auVar176._4_4_ * fVar142 + auVar104._4_4_;
  auVar168._8_4_ = auVar176._8_4_ * fVar210 + auVar104._8_4_;
  auVar168._12_4_ = auVar176._12_4_ * fVar230 + auVar104._12_4_;
  auVar104 = vcvtdq2ps_avx(auVar150);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar82 * 0x16 + 6);
  auVar176 = vpmovsxwd_avx(auVar18);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar104);
  auVar327._0_4_ = auVar176._0_4_ * fVar191 + auVar104._0_4_;
  auVar327._4_4_ = auVar176._4_4_ * fVar142 + auVar104._4_4_;
  auVar327._8_4_ = auVar176._8_4_ * fVar210 + auVar104._8_4_;
  auVar327._12_4_ = auVar176._12_4_ * fVar230 + auVar104._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar82 * 0x14 + 6);
  auVar104 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar82 * 0x18 + 6);
  auVar176 = vpmovsxwd_avx(auVar22);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar104);
  auVar343._0_4_ = auVar176._0_4_ * fVar191 + auVar104._0_4_;
  auVar343._4_4_ = auVar176._4_4_ * fVar142 + auVar104._4_4_;
  auVar343._8_4_ = auVar176._8_4_ * fVar210 + auVar104._8_4_;
  auVar343._12_4_ = auVar176._12_4_ * fVar230 + auVar104._12_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar82 * 0x1d + 6);
  auVar104 = vpmovsxwd_avx(auVar96);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar82 * 0x21 + 6);
  auVar176 = vpmovsxwd_avx(auVar101);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar104);
  auVar360._0_4_ = auVar176._0_4_ * fVar191 + auVar104._0_4_;
  auVar360._4_4_ = auVar176._4_4_ * fVar142 + auVar104._4_4_;
  auVar360._8_4_ = auVar176._8_4_ * fVar210 + auVar104._8_4_;
  auVar360._12_4_ = auVar176._12_4_ * fVar230 + auVar104._12_4_;
  auVar363 = ZEXT1664(auVar360);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar82 * 0x1f + 6);
  auVar104 = vpmovsxwd_avx(auVar95);
  auVar104 = vcvtdq2ps_avx(auVar104);
  local_828 = prim;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar82 * 0x23 + 6);
  auVar176 = vpmovsxwd_avx(auVar100);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar104);
  auVar147._0_4_ = auVar104._0_4_ + auVar176._0_4_ * fVar191;
  auVar147._4_4_ = auVar104._4_4_ + auVar176._4_4_ * fVar142;
  auVar147._8_4_ = auVar104._8_4_ + auVar176._8_4_ * fVar210;
  auVar147._12_4_ = auVar104._12_4_ + auVar176._12_4_ * fVar230;
  auVar104 = vsubps_avx(auVar126,auVar282);
  auVar98._0_4_ = fVar209 * auVar104._0_4_;
  auVar98._4_4_ = fVar229 * auVar104._4_4_;
  auVar98._8_4_ = fVar231 * auVar104._8_4_;
  auVar98._12_4_ = fVar232 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar168,auVar282);
  auVar169._0_4_ = fVar209 * auVar104._0_4_;
  auVar169._4_4_ = fVar229 * auVar104._4_4_;
  auVar169._8_4_ = fVar231 * auVar104._8_4_;
  auVar169._12_4_ = fVar232 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar327,auVar237);
  auVar212._0_4_ = fVar263 * auVar104._0_4_;
  auVar212._4_4_ = fVar269 * auVar104._4_4_;
  auVar212._8_4_ = fVar271 * auVar104._8_4_;
  auVar212._12_4_ = fVar273 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar343,auVar237);
  auVar238._0_4_ = fVar263 * auVar104._0_4_;
  auVar238._4_4_ = fVar269 * auVar104._4_4_;
  auVar238._8_4_ = fVar271 * auVar104._8_4_;
  auVar238._12_4_ = fVar273 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar360,auVar193);
  auVar266._0_4_ = fVar315 * auVar104._0_4_;
  auVar266._4_4_ = fVar321 * auVar104._4_4_;
  auVar266._8_4_ = fVar322 * auVar104._8_4_;
  auVar266._12_4_ = fVar323 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar147,auVar193);
  auVar148._0_4_ = fVar315 * auVar104._0_4_;
  auVar148._4_4_ = fVar321 * auVar104._4_4_;
  auVar148._8_4_ = fVar322 * auVar104._8_4_;
  auVar148._12_4_ = fVar323 * auVar104._12_4_;
  auVar104 = vpminsd_avx(auVar98,auVar169);
  auVar176 = vpminsd_avx(auVar212,auVar238);
  auVar104 = vmaxps_avx(auVar104,auVar176);
  auVar176 = vpminsd_avx(auVar266,auVar148);
  uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar317._4_4_ = uVar90;
  auVar317._0_4_ = uVar90;
  auVar317._8_4_ = uVar90;
  auVar317._12_4_ = uVar90;
  auVar176 = vmaxps_avx(auVar176,auVar317);
  auVar104 = vmaxps_avx(auVar104,auVar176);
  local_600._0_4_ = auVar104._0_4_ * 0.99999964;
  local_600._4_4_ = auVar104._4_4_ * 0.99999964;
  local_600._8_4_ = auVar104._8_4_ * 0.99999964;
  local_600._12_4_ = auVar104._12_4_ * 0.99999964;
  auVar104 = vpmaxsd_avx(auVar98,auVar169);
  auVar176 = vpmaxsd_avx(auVar212,auVar238);
  auVar104 = vminps_avx(auVar104,auVar176);
  auVar176 = vpmaxsd_avx(auVar266,auVar148);
  fVar315 = (ray->super_RayK<1>).tfar;
  auVar170._4_4_ = fVar315;
  auVar170._0_4_ = fVar315;
  auVar170._8_4_ = fVar315;
  auVar170._12_4_ = fVar315;
  auVar176 = vminps_avx(auVar176,auVar170);
  auVar104 = vminps_avx(auVar104,auVar176);
  auVar103._0_4_ = auVar104._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar104._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar104._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar104._12_4_ * 1.0000004;
  auVar104 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar176 = vpcmpgtd_avx(auVar104,_DAT_01f4ad30);
  auVar104 = vcmpps_avx(local_600,auVar103,2);
  auVar104 = vandps_avx(auVar104,auVar176);
  uVar90 = vmovmskps_avx(auVar104);
  uVar82 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar90);
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
LAB_008c19d8:
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  if (uVar82 == 0) {
    return;
  }
  lVar89 = 0;
  if (uVar82 != 0) {
    for (; (uVar82 >> lVar89 & 1) == 0; lVar89 = lVar89 + 1) {
    }
  }
  uVar86 = *(uint *)(local_828 + 2);
  pGVar12 = (context->scene->geometries).items[uVar86].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)*(uint *)(local_828 + lVar89 * 4 + 6) *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar345 = ZEXT3264(auVar129);
  fVar315 = (pGVar12->time_range).lower;
  fVar315 = pGVar12->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar315) /
            ((pGVar12->time_range).upper - fVar315));
  auVar104 = vroundss_avx(ZEXT416((uint)fVar315),ZEXT416((uint)fVar315),9);
  auVar104 = vminss_avx(auVar104,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar104 = vmaxss_avx(ZEXT816(0) << 0x20,auVar104);
  fVar315 = fVar315 - auVar104._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar104._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar88);
  lVar15 = *(long *)(_Var13 + 0x38 + lVar88);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar88);
  auVar104 = vshufps_avx(ZEXT416((uint)fVar315),ZEXT416((uint)fVar315),0);
  pfVar1 = (float *)(lVar15 + uVar83 * lVar16);
  fVar263 = auVar104._0_4_;
  fVar269 = auVar104._4_4_;
  fVar271 = auVar104._8_4_;
  fVar273 = auVar104._12_4_;
  pfVar2 = (float *)(lVar15 + (uVar83 + 1) * lVar16);
  pfVar3 = (float *)(lVar15 + (uVar83 + 2) * lVar16);
  pfVar4 = (float *)(lVar15 + lVar16 * (uVar83 + 3));
  lVar15 = *(long *)(_Var13 + lVar88);
  auVar104 = vshufps_avx(ZEXT416((uint)(1.0 - fVar315)),ZEXT416((uint)(1.0 - fVar315)),0);
  pfVar5 = (float *)(lVar15 + lVar14 * uVar83);
  fVar315 = auVar104._0_4_;
  fVar321 = auVar104._4_4_;
  fVar322 = auVar104._8_4_;
  fVar323 = auVar104._12_4_;
  pfVar6 = (float *)(lVar15 + lVar14 * (uVar83 + 1));
  pfVar7 = (float *)(lVar15 + lVar14 * (uVar83 + 2));
  auVar149._0_4_ = fVar263 * *pfVar1 + fVar315 * *pfVar5;
  auVar149._4_4_ = fVar269 * pfVar1[1] + fVar321 * pfVar5[1];
  auVar149._8_4_ = fVar271 * pfVar1[2] + fVar322 * pfVar5[2];
  auVar149._12_4_ = fVar273 * pfVar1[3] + fVar323 * pfVar5[3];
  auVar171._0_4_ = fVar315 * *pfVar6 + fVar263 * *pfVar2;
  auVar171._4_4_ = fVar321 * pfVar6[1] + fVar269 * pfVar2[1];
  auVar171._8_4_ = fVar322 * pfVar6[2] + fVar271 * pfVar2[2];
  auVar171._12_4_ = fVar323 * pfVar6[3] + fVar273 * pfVar2[3];
  auVar194._0_4_ = fVar315 * *pfVar7 + fVar263 * *pfVar3;
  auVar194._4_4_ = fVar321 * pfVar7[1] + fVar269 * pfVar3[1];
  auVar194._8_4_ = fVar322 * pfVar7[2] + fVar271 * pfVar3[2];
  auVar194._12_4_ = fVar323 * pfVar7[3] + fVar273 * pfVar3[3];
  pfVar1 = (float *)(lVar15 + lVar14 * (uVar83 + 3));
  auVar213._0_4_ = fVar315 * *pfVar1 + fVar263 * *pfVar4;
  auVar213._4_4_ = fVar321 * pfVar1[1] + fVar269 * pfVar4[1];
  auVar213._8_4_ = fVar322 * pfVar1[2] + fVar271 * pfVar4[2];
  auVar213._12_4_ = fVar323 * pfVar1[3] + fVar273 * pfVar4[3];
  auVar92._0_4_ = (auVar149._0_4_ + auVar171._0_4_ + auVar194._0_4_ + auVar213._0_4_) * 0.25;
  auVar92._4_4_ = (auVar149._4_4_ + auVar171._4_4_ + auVar194._4_4_ + auVar213._4_4_) * 0.25;
  auVar92._8_4_ = (auVar149._8_4_ + auVar171._8_4_ + auVar194._8_4_ + auVar213._8_4_) * 0.25;
  auVar92._12_4_ = (auVar149._12_4_ + auVar171._12_4_ + auVar194._12_4_ + auVar213._12_4_) * 0.25;
  aVar9 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar104 = vsubps_avx(auVar92,(undefined1  [16])aVar9);
  auVar104 = vdpps_avx(auVar104,(undefined1  [16])aVar10,0x7f);
  auVar176 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar20 = vrcpss_avx(auVar176,auVar176);
  auVar320 = ZEXT464(0x40000000);
  fVar315 = auVar104._0_4_ * auVar20._0_4_ * (2.0 - auVar20._0_4_ * auVar176._0_4_);
  local_840 = ZEXT416((uint)fVar315);
  auVar176 = vshufps_avx(ZEXT416((uint)fVar315),ZEXT416((uint)fVar315),0);
  fVar315 = aVar10.x;
  fVar321 = aVar10.y;
  fVar322 = aVar10.z;
  aVar141 = aVar10.field_3;
  auVar239._0_4_ = aVar9.x + fVar315 * auVar176._0_4_;
  auVar239._4_4_ = aVar9.y + fVar321 * auVar176._4_4_;
  auVar239._8_4_ = aVar9.z + fVar322 * auVar176._8_4_;
  auVar239._12_4_ = aVar9.field_3.w + aVar141.w * auVar176._12_4_;
  auVar104 = vblendps_avx(auVar239,_DAT_01f45a50,8);
  auVar244 = ZEXT1664(auVar104);
  auVar18 = vsubps_avx(auVar149,auVar104);
  auVar268 = ZEXT1664(auVar18);
  auVar21 = vsubps_avx(auVar194,auVar104);
  auVar22 = vsubps_avx(auVar171,auVar104);
  _local_990 = vsubps_avx(auVar213,auVar104);
  auVar228 = ZEXT1664(_local_990);
  auVar104 = vshufps_avx(auVar18,auVar18,0);
  auVar20 = vshufps_avx(auVar18,auVar18,0x55);
  register0x00001290 = auVar20;
  _local_1e0 = auVar20;
  auVar20 = vshufps_avx(auVar18,auVar18,0xaa);
  register0x00001290 = auVar20;
  _local_200 = auVar20;
  auVar20 = vshufps_avx(auVar18,auVar18,0xff);
  register0x00001290 = auVar20;
  _local_220 = auVar20;
  auVar20 = vshufps_avx(auVar22,auVar22,0);
  register0x00001290 = auVar20;
  _local_240 = auVar20;
  auVar20 = vshufps_avx(auVar22,auVar22,0x55);
  register0x00001290 = auVar20;
  _local_260 = auVar20;
  auVar20 = vshufps_avx(auVar22,auVar22,0xaa);
  register0x00001290 = auVar20;
  _local_280 = auVar20;
  auVar119._0_4_ = fVar315 * fVar315;
  auVar119._4_4_ = fVar321 * fVar321;
  auVar119._8_4_ = fVar322 * fVar322;
  auVar119._12_4_ = aVar141.w * aVar141.w;
  auVar20 = vshufps_avx(auVar119,auVar119,0xaa);
  auVar173 = vshufps_avx(auVar119,auVar119,0x55);
  auVar150 = vshufps_avx(auVar22,auVar22,0xff);
  register0x000012d0 = auVar150;
  _local_3e0 = auVar150;
  auVar150 = vshufps_avx(auVar119,auVar119,0);
  local_2a0._0_4_ = auVar150._0_4_ + auVar173._0_4_ + auVar20._0_4_;
  local_2a0._4_4_ = auVar150._4_4_ + auVar173._4_4_ + auVar20._4_4_;
  local_2a0._8_4_ = auVar150._8_4_ + auVar173._8_4_ + auVar20._8_4_;
  local_2a0._12_4_ = auVar150._12_4_ + auVar173._12_4_ + auVar20._12_4_;
  local_2a0._16_4_ = auVar150._0_4_ + auVar173._0_4_ + auVar20._0_4_;
  local_2a0._20_4_ = auVar150._4_4_ + auVar173._4_4_ + auVar20._4_4_;
  local_2a0._24_4_ = auVar150._8_4_ + auVar173._8_4_ + auVar20._8_4_;
  local_2a0._28_4_ = auVar150._12_4_ + auVar173._12_4_ + auVar20._12_4_;
  auVar20 = vshufps_avx(auVar21,auVar21,0);
  register0x00001250 = auVar20;
  _local_400 = auVar20;
  auVar20 = vshufps_avx(auVar21,auVar21,0x55);
  register0x00001250 = auVar20;
  _local_420 = auVar20;
  auVar20 = vshufps_avx(auVar21,auVar21,0xaa);
  register0x00001250 = auVar20;
  _local_440 = auVar20;
  auVar20 = vshufps_avx(auVar21,auVar21,0xff);
  register0x00001250 = auVar20;
  _local_460 = auVar20;
  auVar20 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar20;
  _local_480 = auVar20;
  auVar20 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar20;
  _local_4a0 = auVar20;
  auVar20 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar20;
  _local_4c0 = auVar20;
  auVar20 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar20;
  _local_4e0 = auVar20;
  local_800._16_16_ = auVar176;
  local_800._0_16_ = auVar176;
  uVar85 = 0;
  local_b1c = 1;
  local_620 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  local_780 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_77c = local_780;
  fStack_778 = local_780;
  fStack_774 = local_780;
  fStack_770 = local_780;
  fStack_76c = local_780;
  fStack_768 = local_780;
  fStack_764 = local_780;
  local_500 = vandps_avx(auVar129,local_2a0);
  local_5f0 = ZEXT816(0x3f80000000000000);
  uVar83 = (ulong)*(uint *)(local_828 + lVar89 * 4 + 6);
  do {
    auVar176 = vmovshdup_avx(local_5f0);
    auVar173 = vsubps_avx(auVar176,local_5f0);
    auVar176 = vshufps_avx(local_5f0,local_5f0,0);
    local_760._16_16_ = auVar176;
    local_760._0_16_ = auVar176;
    auVar20 = vshufps_avx(auVar173,auVar173,0);
    register0x00001250 = auVar20;
    _local_7a0 = auVar20;
    fVar321 = auVar20._0_4_;
    fVar191 = auVar20._4_4_;
    fVar232 = auVar20._8_4_;
    fVar190 = auVar20._12_4_;
    fVar143 = auVar176._0_4_;
    auVar184._0_4_ = fVar143 + fVar321 * 0.0;
    fVar165 = auVar176._4_4_;
    auVar184._4_4_ = fVar165 + fVar191 * 0.14285715;
    fVar166 = auVar176._8_4_;
    auVar184._8_4_ = fVar166 + fVar232 * 0.2857143;
    fVar167 = auVar176._12_4_;
    auVar184._12_4_ = fVar167 + fVar190 * 0.42857146;
    auVar184._16_4_ = fVar143 + fVar321 * 0.5714286;
    auVar184._20_4_ = fVar165 + fVar191 * 0.71428573;
    auVar184._24_4_ = fVar166 + fVar232 * 0.8571429;
    auVar184._28_4_ = fVar167 + fVar190;
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = 0x3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar105 = vsubps_avx(auVar130,auVar184);
    fVar322 = auVar105._0_4_;
    fVar323 = auVar105._4_4_;
    fVar263 = auVar105._8_4_;
    fVar269 = auVar105._12_4_;
    fVar271 = auVar105._16_4_;
    fVar273 = auVar105._20_4_;
    fVar142 = auVar105._24_4_;
    fVar231 = fVar322 * fVar322 * fVar322;
    fVar245 = fVar323 * fVar323 * fVar323;
    fVar248 = fVar263 * fVar263 * fVar263;
    fVar251 = fVar269 * fVar269 * fVar269;
    fVar254 = fVar271 * fVar271 * fVar271;
    fVar257 = fVar273 * fVar273 * fVar273;
    fVar260 = fVar142 * fVar142 * fVar142;
    fVar264 = auVar184._0_4_ * auVar184._0_4_ * auVar184._0_4_;
    fVar270 = auVar184._4_4_ * auVar184._4_4_ * auVar184._4_4_;
    fVar272 = auVar184._8_4_ * auVar184._8_4_ * auVar184._8_4_;
    fVar274 = auVar184._12_4_ * auVar184._12_4_ * auVar184._12_4_;
    fVar275 = auVar184._16_4_ * auVar184._16_4_ * auVar184._16_4_;
    fVar276 = auVar184._20_4_ * auVar184._20_4_ * auVar184._20_4_;
    fVar277 = auVar184._24_4_ * auVar184._24_4_ * auVar184._24_4_;
    fVar315 = auVar228._28_4_;
    fVar210 = auVar184._0_4_ * fVar322;
    fVar230 = auVar184._4_4_ * fVar323;
    fVar209 = auVar184._8_4_ * fVar263;
    fVar229 = auVar184._12_4_ * fVar269;
    fVar233 = auVar184._16_4_ * fVar271;
    fVar234 = auVar184._20_4_ * fVar273;
    fVar235 = auVar184._24_4_ * fVar142;
    fVar337 = auVar363._28_4_ + 1.0;
    fVar313 = auVar268._28_4_ + fVar315 + fVar337;
    fVar324 = fVar337 + auVar244._28_4_ + auVar345._28_4_ + auVar320._28_4_;
    fVar337 = fVar231 * 0.16666667;
    fVar246 = fVar245 * 0.16666667;
    fVar249 = fVar248 * 0.16666667;
    fVar252 = fVar251 * 0.16666667;
    fVar255 = fVar254 * 0.16666667;
    fVar258 = fVar257 * 0.16666667;
    fVar261 = fVar260 * 0.16666667;
    fVar278 = (fVar264 + fVar231 * 4.0 + fVar322 * fVar210 * 12.0 + auVar184._0_4_ * fVar210 * 6.0)
              * 0.16666667;
    fVar289 = (fVar270 + fVar245 * 4.0 + fVar323 * fVar230 * 12.0 + auVar184._4_4_ * fVar230 * 6.0)
              * 0.16666667;
    fVar293 = (fVar272 + fVar248 * 4.0 + fVar263 * fVar209 * 12.0 + auVar184._8_4_ * fVar209 * 6.0)
              * 0.16666667;
    fVar297 = (fVar274 + fVar251 * 4.0 + fVar269 * fVar229 * 12.0 + auVar184._12_4_ * fVar229 * 6.0)
              * 0.16666667;
    fVar301 = (fVar275 + fVar254 * 4.0 + fVar271 * fVar233 * 12.0 + auVar184._16_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar305 = (fVar276 + fVar257 * 4.0 + fVar273 * fVar234 * 12.0 + auVar184._20_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar309 = (fVar277 + fVar260 * 4.0 + fVar142 * fVar235 * 12.0 + auVar184._24_4_ * fVar235 * 6.0)
              * 0.16666667;
    fVar231 = (fVar264 * 4.0 + fVar231 + auVar184._0_4_ * fVar210 * 12.0 + fVar322 * fVar210 * 6.0)
              * 0.16666667;
    fVar245 = (fVar270 * 4.0 + fVar245 + auVar184._4_4_ * fVar230 * 12.0 + fVar323 * fVar230 * 6.0)
              * 0.16666667;
    fVar248 = (fVar272 * 4.0 + fVar248 + auVar184._8_4_ * fVar209 * 12.0 + fVar263 * fVar209 * 6.0)
              * 0.16666667;
    fVar251 = (fVar274 * 4.0 + fVar251 + auVar184._12_4_ * fVar229 * 12.0 + fVar269 * fVar229 * 6.0)
              * 0.16666667;
    fVar254 = (fVar275 * 4.0 + fVar254 + auVar184._16_4_ * fVar233 * 12.0 + fVar271 * fVar233 * 6.0)
              * 0.16666667;
    fVar257 = (fVar276 * 4.0 + fVar257 + auVar184._20_4_ * fVar234 * 12.0 + fVar273 * fVar234 * 6.0)
              * 0.16666667;
    fVar260 = (fVar277 * 4.0 + fVar260 + auVar184._24_4_ * fVar235 * 12.0 + fVar142 * fVar235 * 6.0)
              * 0.16666667;
    fVar264 = fVar264 * 0.16666667;
    fVar270 = fVar270 * 0.16666667;
    fVar272 = fVar272 * 0.16666667;
    fVar274 = fVar274 * 0.16666667;
    fVar275 = fVar275 * 0.16666667;
    fVar276 = fVar276 * 0.16666667;
    fVar277 = fVar277 * 0.16666667;
    fVar358 = auVar345._28_4_ + 12.0;
    fVar325 = fVar324 + 12.166667;
    fVar114 = auVar104._0_4_;
    fVar115 = auVar104._4_4_;
    fVar116 = auVar104._8_4_;
    local_880 = fVar114 * fVar337 +
                fVar278 * (float)local_240._0_4_ +
                fVar264 * (float)local_480._0_4_ + fVar231 * (float)local_400._0_4_;
    fStack_87c = fVar115 * fVar246 +
                 fVar289 * (float)local_240._4_4_ +
                 fVar270 * (float)local_480._4_4_ + fVar245 * (float)local_400._4_4_;
    fStack_878 = fVar116 * fVar249 +
                 fVar293 * fStack_238 + fVar272 * fStack_478 + fVar248 * fStack_3f8;
    fStack_874 = auVar104._12_4_ * fVar252 +
                 fVar297 * fStack_234 + fVar274 * fStack_474 + fVar251 * fStack_3f4;
    fStack_870 = fVar114 * fVar255 +
                 fVar301 * fStack_230 + fVar275 * fStack_470 + fVar254 * fStack_3f0;
    fStack_86c = fVar115 * fVar258 +
                 fVar305 * fStack_22c + fVar276 * fStack_46c + fVar257 * fStack_3ec;
    fStack_868 = fVar116 * fVar261 +
                 fVar309 * fStack_228 + fVar277 * fStack_468 + fVar260 * fStack_3e8;
    fStack_864 = fVar313 + fVar325;
    fVar279 = (float)local_1e0._0_4_ * fVar337 +
              (float)local_260._0_4_ * fVar278 +
              fVar264 * (float)local_4a0._0_4_ + fVar231 * (float)local_420._0_4_;
    fVar290 = (float)local_1e0._4_4_ * fVar246 +
              (float)local_260._4_4_ * fVar289 +
              fVar270 * (float)local_4a0._4_4_ + fVar245 * (float)local_420._4_4_;
    fVar294 = fStack_1d8 * fVar249 +
              fStack_258 * fVar293 + fVar272 * fStack_498 + fVar248 * fStack_418;
    fVar298 = fStack_1d4 * fVar252 +
              fStack_254 * fVar297 + fVar274 * fStack_494 + fVar251 * fStack_414;
    fVar302 = fStack_1d0 * fVar255 +
              fStack_250 * fVar301 + fVar275 * fStack_490 + fVar254 * fStack_410;
    fVar306 = fStack_1cc * fVar258 +
              fStack_24c * fVar305 + fVar276 * fStack_48c + fVar257 * fStack_40c;
    fVar310 = fStack_1c8 * fVar261 +
              fStack_248 * fVar309 + fVar277 * fStack_488 + fVar260 * fStack_408;
    fVar314 = fStack_864 + fVar358 + 12.166667;
    local_860 = (float)local_200._0_4_ * fVar337 +
                (float)local_280._0_4_ * fVar278 +
                fVar264 * (float)local_4c0._0_4_ + fVar231 * (float)local_440._0_4_;
    fStack_85c = (float)local_200._4_4_ * fVar246 +
                 (float)local_280._4_4_ * fVar289 +
                 fVar270 * (float)local_4c0._4_4_ + fVar245 * (float)local_440._4_4_;
    fStack_858 = fStack_1f8 * fVar249 +
                 fStack_278 * fVar293 + fVar272 * fStack_4b8 + fVar248 * fStack_438;
    aStack_854.w = fStack_1f4 * fVar252 +
                   fStack_274 * fVar297 + fVar274 * fStack_4b4 + fVar251 * fStack_434;
    fStack_850 = fStack_1f0 * fVar255 +
                 fStack_270 * fVar301 + fVar275 * fStack_4b0 + fVar254 * fStack_430;
    fStack_84c = fStack_1ec * fVar258 +
                 fStack_26c * fVar305 + fVar276 * fStack_4ac + fVar257 * fStack_42c;
    fStack_848 = fStack_1e8 * fVar261 +
                 fStack_268 * fVar309 + fVar277 * fStack_4a8 + fVar260 * fStack_428;
    fStack_844 = fVar314 + fVar358 + auVar363._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_220._0_4_ * fVar337 +
         fVar278 * (float)local_3e0._0_4_ +
         fVar231 * (float)local_460._0_4_ + fVar264 * (float)local_4e0._0_4_;
    local_ae0._4_4_ =
         (float)local_220._4_4_ * fVar246 +
         fVar289 * (float)local_3e0._4_4_ +
         fVar245 * (float)local_460._4_4_ + fVar270 * (float)local_4e0._4_4_;
    fStack_ad8 = fStack_218 * fVar249 +
                 fVar293 * fStack_3d8 + fVar248 * fStack_458 + fVar272 * fStack_4d8;
    fStack_ad4 = fStack_214 * fVar252 +
                 fVar297 * fStack_3d4 + fVar251 * fStack_454 + fVar274 * fStack_4d4;
    fStack_ad0 = fStack_210 * fVar255 +
                 fVar301 * fStack_3d0 + fVar254 * fStack_450 + fVar275 * fStack_4d0;
    fStack_acc = fStack_20c * fVar258 +
                 fVar305 * fStack_3cc + fVar257 * fStack_44c + fVar276 * fStack_4cc;
    fStack_ac8 = fStack_208 * fVar261 +
                 fVar309 * fStack_3c8 + fVar260 * fStack_448 + fVar277 * fStack_4c8;
    fStack_ac4 = auVar244._28_4_ + fVar313 + fVar324 + auVar268._28_4_;
    auVar25._4_4_ = auVar184._4_4_ * -auVar184._4_4_;
    auVar25._0_4_ = auVar184._0_4_ * -auVar184._0_4_;
    auVar25._8_4_ = auVar184._8_4_ * -auVar184._8_4_;
    auVar25._12_4_ = auVar184._12_4_ * -auVar184._12_4_;
    auVar25._16_4_ = auVar184._16_4_ * -auVar184._16_4_;
    auVar25._20_4_ = auVar184._20_4_ * -auVar184._20_4_;
    auVar25._24_4_ = auVar184._24_4_ * -auVar184._24_4_;
    auVar25._28_4_ = auVar184._28_4_;
    auVar23._4_4_ = fVar230 * 4.0;
    auVar23._0_4_ = fVar210 * 4.0;
    auVar23._8_4_ = fVar209 * 4.0;
    auVar23._12_4_ = fVar229 * 4.0;
    auVar23._16_4_ = fVar233 * 4.0;
    auVar23._20_4_ = fVar234 * 4.0;
    auVar23._24_4_ = fVar235 * 4.0;
    auVar23._28_4_ = fVar315;
    auVar105 = vsubps_avx(auVar25,auVar23);
    fVar260 = fVar322 * -fVar322 * 0.5;
    fVar261 = fVar323 * -fVar323 * 0.5;
    fVar264 = fVar263 * -fVar263 * 0.5;
    fVar270 = fVar269 * -fVar269 * 0.5;
    fVar272 = fVar271 * -fVar271 * 0.5;
    fVar274 = fVar273 * -fVar273 * 0.5;
    fVar275 = fVar142 * -fVar142 * 0.5;
    fVar248 = auVar105._0_4_ * 0.5;
    fVar249 = auVar105._4_4_ * 0.5;
    fVar251 = auVar105._8_4_ * 0.5;
    fVar254 = auVar105._12_4_ * 0.5;
    fVar255 = auVar105._16_4_ * 0.5;
    fVar257 = auVar105._20_4_ * 0.5;
    fVar258 = auVar105._24_4_ * 0.5;
    fVar231 = (fVar322 * fVar322 + fVar210 * 4.0) * 0.5;
    fVar337 = (fVar323 * fVar323 + fVar230 * 4.0) * 0.5;
    fVar245 = (fVar263 * fVar263 + fVar209 * 4.0) * 0.5;
    fVar246 = (fVar269 * fVar269 + fVar229 * 4.0) * 0.5;
    fVar233 = (fVar271 * fVar271 + fVar233 * 4.0) * 0.5;
    fVar234 = (fVar273 * fVar273 + fVar234 * 4.0) * 0.5;
    fVar235 = (fVar142 * fVar142 + fVar235 * 4.0) * 0.5;
    fVar322 = auVar184._0_4_ * auVar184._0_4_ * 0.5;
    fVar323 = auVar184._4_4_ * auVar184._4_4_ * 0.5;
    fVar263 = auVar184._8_4_ * auVar184._8_4_ * 0.5;
    fVar142 = auVar184._12_4_ * auVar184._12_4_ * 0.5;
    fVar210 = auVar184._16_4_ * auVar184._16_4_ * 0.5;
    fVar230 = auVar184._20_4_ * auVar184._20_4_ * 0.5;
    fVar229 = auVar184._24_4_ * auVar184._24_4_ * 0.5;
    fVar252 = auVar105._28_4_ + fVar167 + fVar315 + fVar325 + fVar315;
    auVar176 = vpermilps_avx(ZEXT416((uint)(auVar173._0_4_ * 0.04761905)),0);
    fVar269 = auVar176._0_4_;
    fVar280 = fVar269 * (fVar114 * fVar260 +
                        (float)local_240._0_4_ * fVar248 +
                        fVar231 * (float)local_400._0_4_ + fVar322 * (float)local_480._0_4_);
    fVar271 = auVar176._4_4_;
    fVar291 = fVar271 * (fVar115 * fVar261 +
                        (float)local_240._4_4_ * fVar249 +
                        fVar337 * (float)local_400._4_4_ + fVar323 * (float)local_480._4_4_);
    local_9e0._4_4_ = fVar291;
    local_9e0._0_4_ = fVar280;
    fVar273 = auVar176._8_4_;
    fVar295 = fVar273 * (fVar116 * fVar264 +
                        fStack_238 * fVar251 + fVar245 * fStack_3f8 + fVar263 * fStack_478);
    local_9e0._8_4_ = fVar295;
    fVar209 = auVar176._12_4_;
    fVar299 = fVar209 * (auVar104._12_4_ * fVar270 +
                        fStack_234 * fVar254 + fVar246 * fStack_3f4 + fVar142 * fStack_474);
    local_9e0._12_4_ = fVar299;
    fVar303 = fVar269 * (fVar114 * fVar272 +
                        fStack_230 * fVar255 + fVar233 * fStack_3f0 + fVar210 * fStack_470);
    local_9e0._16_4_ = fVar303;
    fVar307 = fVar271 * (fVar115 * fVar274 +
                        fStack_22c * fVar257 + fVar234 * fStack_3ec + fVar230 * fStack_46c);
    local_9e0._20_4_ = fVar307;
    fVar311 = fVar273 * (fVar116 * fVar275 +
                        fStack_228 * fVar258 + fVar235 * fStack_3e8 + fVar229 * fStack_468);
    local_9e0._24_4_ = fVar311;
    local_9e0._28_4_ = fStack_844 + fVar325;
    fVar326 = fVar269 * ((float)local_1e0._0_4_ * fVar260 +
                        (float)local_260._0_4_ * fVar248 +
                        fVar231 * (float)local_420._0_4_ + fVar322 * (float)local_4a0._0_4_);
    fVar331 = fVar271 * ((float)local_1e0._4_4_ * fVar261 +
                        (float)local_260._4_4_ * fVar249 +
                        fVar337 * (float)local_420._4_4_ + fVar323 * (float)local_4a0._4_4_);
    local_980._4_4_ = fVar331;
    local_980._0_4_ = fVar326;
    fVar332 = fVar273 * (fStack_1d8 * fVar264 +
                        fStack_258 * fVar251 + fVar245 * fStack_418 + fVar263 * fStack_498);
    local_980._8_4_ = fVar332;
    fVar333 = fVar209 * (fStack_1d4 * fVar270 +
                        fStack_254 * fVar254 + fVar246 * fStack_414 + fVar142 * fStack_494);
    local_980._12_4_ = fVar333;
    fVar334 = fVar269 * (fStack_1d0 * fVar272 +
                        fStack_250 * fVar255 + fVar233 * fStack_410 + fVar210 * fStack_490);
    local_980._16_4_ = fVar334;
    fVar335 = fVar271 * (fStack_1cc * fVar274 +
                        fStack_24c * fVar257 + fVar234 * fStack_40c + fVar230 * fStack_48c);
    local_980._20_4_ = fVar335;
    fVar336 = fVar273 * (fStack_1c8 * fVar275 +
                        fStack_248 * fVar258 + fVar235 * fStack_408 + fVar229 * fStack_488);
    local_980._24_4_ = fVar336;
    local_980._28_4_ = uStack_1e4;
    fVar338 = fVar269 * ((float)local_200._0_4_ * fVar260 +
                        fVar322 * (float)local_4c0._0_4_ + fVar231 * (float)local_440._0_4_ +
                        (float)local_280._0_4_ * fVar248);
    fVar346 = fVar271 * ((float)local_200._4_4_ * fVar261 +
                        fVar323 * (float)local_4c0._4_4_ + fVar337 * (float)local_440._4_4_ +
                        (float)local_280._4_4_ * fVar249);
    auVar27._4_4_ = fVar346;
    auVar27._0_4_ = fVar338;
    fVar348 = fVar273 * (fStack_1f8 * fVar264 +
                        fVar263 * fStack_4b8 + fVar245 * fStack_438 + fStack_278 * fVar251);
    auVar27._8_4_ = fVar348;
    fVar350 = fVar209 * (fStack_1f4 * fVar270 +
                        fVar142 * fStack_4b4 + fVar246 * fStack_434 + fStack_274 * fVar254);
    auVar27._12_4_ = fVar350;
    fVar352 = fVar269 * (fStack_1f0 * fVar272 +
                        fVar210 * fStack_4b0 + fVar233 * fStack_430 + fStack_270 * fVar255);
    auVar27._16_4_ = fVar352;
    fVar354 = fVar271 * (fStack_1ec * fVar274 +
                        fVar230 * fStack_4ac + fVar234 * fStack_42c + fStack_26c * fVar257);
    auVar27._20_4_ = fVar354;
    fVar356 = fVar273 * (fStack_1e8 * fVar275 +
                        fVar229 * fStack_4a8 + fVar235 * fStack_428 + fStack_268 * fVar258);
    auVar27._24_4_ = fVar356;
    auVar27._28_4_ = fStack_204;
    fVar231 = fVar269 * ((float)local_220._0_4_ * fVar260 +
                        fVar248 * (float)local_3e0._0_4_ +
                        fVar322 * (float)local_4e0._0_4_ + fVar231 * (float)local_460._0_4_);
    fVar248 = fVar271 * ((float)local_220._4_4_ * fVar261 +
                        fVar249 * (float)local_3e0._4_4_ +
                        fVar323 * (float)local_4e0._4_4_ + fVar337 * (float)local_460._4_4_);
    auVar26._4_4_ = fVar248;
    auVar26._0_4_ = fVar231;
    fVar249 = fVar273 * (fStack_218 * fVar264 +
                        fVar251 * fStack_3d8 + fVar263 * fStack_4d8 + fVar245 * fStack_458);
    auVar26._8_4_ = fVar249;
    fVar209 = fVar209 * (fStack_214 * fVar270 +
                        fVar254 * fStack_3d4 + fVar142 * fStack_4d4 + fVar246 * fStack_454);
    auVar26._12_4_ = fVar209;
    fVar269 = fVar269 * (fStack_210 * fVar272 +
                        fVar255 * fStack_3d0 + fVar210 * fStack_4d0 + fVar233 * fStack_450);
    auVar26._16_4_ = fVar269;
    fVar271 = fVar271 * (fStack_20c * fVar274 +
                        fVar257 * fStack_3cc + fVar230 * fStack_4cc + fVar234 * fStack_44c);
    auVar26._20_4_ = fVar271;
    fVar273 = fVar273 * (fStack_208 * fVar275 +
                        fVar258 * fStack_3c8 + fVar229 * fStack_4c8 + fVar235 * fStack_448);
    auVar26._24_4_ = fVar273;
    auVar26._28_4_ = fVar252;
    auVar72._4_4_ = fVar290;
    auVar72._0_4_ = fVar279;
    auVar72._8_4_ = fVar294;
    auVar72._12_4_ = fVar298;
    auVar72._16_4_ = fVar302;
    auVar72._20_4_ = fVar306;
    auVar72._24_4_ = fVar310;
    auVar72._28_4_ = fVar314;
    auVar105 = vperm2f128_avx(auVar72,auVar72,1);
    auVar105 = vshufps_avx(auVar105,auVar72,0x30);
    auVar23 = vshufps_avx(auVar72,auVar105,0x29);
    auVar77._4_4_ = fStack_85c;
    auVar77._0_4_ = local_860;
    auVar77._8_4_ = fStack_858;
    auVar77._12_4_ = aStack_854;
    auVar77._16_4_ = fStack_850;
    auVar77._20_4_ = fStack_84c;
    auVar77._24_4_ = fStack_848;
    auVar77._28_4_ = fStack_844;
    auVar105 = vperm2f128_avx(auVar77,auVar77,1);
    auVar105 = vshufps_avx(auVar105,auVar77,0x30);
    local_8a0 = vshufps_avx(auVar77,auVar105,0x29);
    auVar129 = vsubps_avx(_local_ae0,auVar26);
    auVar105 = vperm2f128_avx(auVar129,auVar129,1);
    auVar105 = vshufps_avx(auVar105,auVar129,0x30);
    _local_7c0 = vshufps_avx(auVar129,auVar105,0x29);
    local_2c0 = vsubps_avx(auVar23,auVar72);
    local_6e0 = vsubps_avx(local_8a0,auVar77);
    fVar322 = local_2c0._0_4_;
    fVar142 = local_2c0._4_4_;
    auVar107._4_4_ = fVar346 * fVar142;
    auVar107._0_4_ = fVar338 * fVar322;
    fVar337 = local_2c0._8_4_;
    auVar107._8_4_ = fVar348 * fVar337;
    fVar234 = local_2c0._12_4_;
    auVar107._12_4_ = fVar350 * fVar234;
    fVar257 = local_2c0._16_4_;
    auVar107._16_4_ = fVar352 * fVar257;
    fVar272 = local_2c0._20_4_;
    auVar107._20_4_ = fVar354 * fVar272;
    fVar289 = local_2c0._24_4_;
    auVar107._24_4_ = fVar356 * fVar289;
    auVar107._28_4_ = auVar129._28_4_;
    fVar323 = local_6e0._0_4_;
    fVar210 = local_6e0._4_4_;
    auVar186._4_4_ = fVar331 * fVar210;
    auVar186._0_4_ = fVar326 * fVar323;
    fVar245 = local_6e0._8_4_;
    auVar186._8_4_ = fVar332 * fVar245;
    fVar235 = local_6e0._12_4_;
    auVar186._12_4_ = fVar333 * fVar235;
    fVar258 = local_6e0._16_4_;
    auVar186._16_4_ = fVar334 * fVar258;
    fVar274 = local_6e0._20_4_;
    auVar186._20_4_ = fVar335 * fVar274;
    fVar293 = local_6e0._24_4_;
    auVar186._24_4_ = fVar336 * fVar293;
    auVar186._28_4_ = auVar105._28_4_;
    auVar25 = vsubps_avx(auVar186,auVar107);
    auVar74._4_4_ = fStack_87c;
    auVar74._0_4_ = local_880;
    auVar74._8_4_ = fStack_878;
    auVar74._12_4_ = fStack_874;
    auVar74._16_4_ = fStack_870;
    auVar74._20_4_ = fStack_86c;
    auVar74._24_4_ = fStack_868;
    auVar74._28_4_ = fStack_864;
    auVar105 = vperm2f128_avx(auVar74,auVar74,1);
    auVar105 = vshufps_avx(auVar105,auVar74,0x30);
    local_900 = vshufps_avx(auVar74,auVar105,0x29);
    local_2e0 = vsubps_avx(local_900,auVar74);
    auVar285._4_4_ = fVar291 * fVar210;
    auVar285._0_4_ = fVar280 * fVar323;
    auVar285._8_4_ = fVar295 * fVar245;
    auVar285._12_4_ = fVar299 * fVar235;
    auVar285._16_4_ = fVar303 * fVar258;
    auVar285._20_4_ = fVar307 * fVar274;
    auVar285._24_4_ = fVar311 * fVar293;
    auVar285._28_4_ = auVar105._28_4_;
    fVar263 = local_2e0._0_4_;
    fVar230 = local_2e0._4_4_;
    auVar28._4_4_ = fVar346 * fVar230;
    auVar28._0_4_ = fVar338 * fVar263;
    fVar246 = local_2e0._8_4_;
    auVar28._8_4_ = fVar348 * fVar246;
    fVar251 = local_2e0._12_4_;
    auVar28._12_4_ = fVar350 * fVar251;
    fVar260 = local_2e0._16_4_;
    auVar28._16_4_ = fVar352 * fVar260;
    fVar275 = local_2e0._20_4_;
    auVar28._20_4_ = fVar354 * fVar275;
    fVar297 = local_2e0._24_4_;
    auVar28._24_4_ = fVar356 * fVar297;
    auVar28._28_4_ = local_8a0._28_4_;
    auVar26 = vsubps_avx(auVar28,auVar285);
    auVar24._4_4_ = fVar331 * fVar230;
    auVar24._0_4_ = fVar326 * fVar263;
    auVar24._8_4_ = fVar332 * fVar246;
    auVar24._12_4_ = fVar333 * fVar251;
    auVar24._16_4_ = fVar334 * fVar260;
    auVar24._20_4_ = fVar335 * fVar275;
    auVar24._24_4_ = fVar336 * fVar297;
    auVar24._28_4_ = local_8a0._28_4_;
    auVar29._4_4_ = fVar291 * fVar142;
    auVar29._0_4_ = fVar280 * fVar322;
    auVar29._8_4_ = fVar295 * fVar337;
    auVar29._12_4_ = fVar299 * fVar234;
    auVar29._16_4_ = fVar303 * fVar257;
    auVar29._20_4_ = fVar307 * fVar272;
    auVar29._24_4_ = fVar311 * fVar289;
    auVar29._28_4_ = fVar325;
    auVar107 = vsubps_avx(auVar29,auVar24);
    fVar315 = auVar107._28_4_;
    fVar229 = auVar26._28_4_ + fVar315;
    auVar185._0_4_ = fVar263 * fVar263 + fVar322 * fVar322 + fVar323 * fVar323;
    auVar185._4_4_ = fVar230 * fVar230 + fVar142 * fVar142 + fVar210 * fVar210;
    auVar185._8_4_ = fVar246 * fVar246 + fVar337 * fVar337 + fVar245 * fVar245;
    auVar185._12_4_ = fVar251 * fVar251 + fVar234 * fVar234 + fVar235 * fVar235;
    auVar185._16_4_ = fVar260 * fVar260 + fVar257 * fVar257 + fVar258 * fVar258;
    auVar185._20_4_ = fVar275 * fVar275 + fVar272 * fVar272 + fVar274 * fVar274;
    auVar185._24_4_ = fVar297 * fVar297 + fVar289 * fVar289 + fVar293 * fVar293;
    auVar185._28_4_ = fVar315 + fVar315 + fVar229;
    auVar105 = vrcpps_avx(auVar185);
    fVar233 = auVar105._0_4_;
    fVar254 = auVar105._4_4_;
    auVar30._4_4_ = fVar254 * auVar185._4_4_;
    auVar30._0_4_ = fVar233 * auVar185._0_4_;
    fVar255 = auVar105._8_4_;
    auVar30._8_4_ = fVar255 * auVar185._8_4_;
    fVar261 = auVar105._12_4_;
    auVar30._12_4_ = fVar261 * auVar185._12_4_;
    fVar264 = auVar105._16_4_;
    auVar30._16_4_ = fVar264 * auVar185._16_4_;
    fVar270 = auVar105._20_4_;
    auVar30._20_4_ = fVar270 * auVar185._20_4_;
    fVar276 = auVar105._24_4_;
    auVar30._24_4_ = fVar276 * auVar185._24_4_;
    auVar30._28_4_ = fVar325;
    auVar361._8_4_ = 0x3f800000;
    auVar361._0_8_ = 0x3f8000003f800000;
    auVar361._12_4_ = 0x3f800000;
    auVar361._16_4_ = 0x3f800000;
    auVar361._20_4_ = 0x3f800000;
    auVar361._24_4_ = 0x3f800000;
    auVar361._28_4_ = 0x3f800000;
    auVar186 = vsubps_avx(auVar361,auVar30);
    fVar233 = auVar186._0_4_ * fVar233 + fVar233;
    fVar254 = auVar186._4_4_ * fVar254 + fVar254;
    fVar255 = auVar186._8_4_ * fVar255 + fVar255;
    fVar261 = auVar186._12_4_ * fVar261 + fVar261;
    fVar264 = auVar186._16_4_ * fVar264 + fVar264;
    fVar270 = auVar186._20_4_ * fVar270 + fVar270;
    fVar276 = auVar186._24_4_ * fVar276 + fVar276;
    auVar129 = vperm2f128_avx(local_980,local_980,1);
    auVar129 = vshufps_avx(auVar129,local_980,0x30);
    local_9c0 = vshufps_avx(local_980,auVar129,0x29);
    auVar129 = vperm2f128_avx(auVar27,auVar27,1);
    auVar129 = vshufps_avx(auVar129,auVar27,0x30);
    local_720 = vshufps_avx(auVar27,auVar129,0x29);
    fVar339 = local_720._0_4_;
    fVar347 = local_720._4_4_;
    auVar31._4_4_ = fVar347 * fVar142;
    auVar31._0_4_ = fVar339 * fVar322;
    fVar349 = local_720._8_4_;
    auVar31._8_4_ = fVar349 * fVar337;
    fVar351 = local_720._12_4_;
    auVar31._12_4_ = fVar351 * fVar234;
    fVar353 = local_720._16_4_;
    auVar31._16_4_ = fVar353 * fVar257;
    fVar355 = local_720._20_4_;
    auVar31._20_4_ = fVar355 * fVar272;
    fVar357 = local_720._24_4_;
    auVar31._24_4_ = fVar357 * fVar289;
    auVar31._28_4_ = auVar129._28_4_;
    fVar359 = local_9c0._0_4_;
    fVar364 = local_9c0._4_4_;
    auVar32._4_4_ = fVar364 * fVar210;
    auVar32._0_4_ = fVar359 * fVar323;
    fVar365 = local_9c0._8_4_;
    auVar32._8_4_ = fVar365 * fVar245;
    fVar366 = local_9c0._12_4_;
    auVar32._12_4_ = fVar366 * fVar235;
    fVar367 = local_9c0._16_4_;
    auVar32._16_4_ = fVar367 * fVar258;
    fVar368 = local_9c0._20_4_;
    auVar32._20_4_ = fVar368 * fVar274;
    fVar369 = local_9c0._24_4_;
    auVar32._24_4_ = fVar369 * fVar293;
    auVar32._28_4_ = uStack_1e4;
    auVar27 = vsubps_avx(auVar32,auVar31);
    auVar129 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar129 = vshufps_avx(auVar129,local_9e0,0x30);
    local_920 = vshufps_avx(local_9e0,auVar129,0x29);
    fVar281 = local_920._0_4_;
    fVar292 = local_920._4_4_;
    auVar33._4_4_ = fVar292 * fVar210;
    auVar33._0_4_ = fVar281 * fVar323;
    fVar296 = local_920._8_4_;
    auVar33._8_4_ = fVar296 * fVar245;
    fVar300 = local_920._12_4_;
    auVar33._12_4_ = fVar300 * fVar235;
    fVar304 = local_920._16_4_;
    auVar33._16_4_ = fVar304 * fVar258;
    fVar308 = local_920._20_4_;
    auVar33._20_4_ = fVar308 * fVar274;
    fVar312 = local_920._24_4_;
    auVar33._24_4_ = fVar312 * fVar293;
    auVar33._28_4_ = auVar129._28_4_;
    auVar34._4_4_ = fVar347 * fVar230;
    auVar34._0_4_ = fVar339 * fVar263;
    auVar34._8_4_ = fVar349 * fVar246;
    auVar34._12_4_ = fVar351 * fVar251;
    auVar34._16_4_ = fVar353 * fVar260;
    auVar34._20_4_ = fVar355 * fVar275;
    uVar87 = local_720._28_4_;
    auVar34._24_4_ = fVar357 * fVar297;
    auVar34._28_4_ = uVar87;
    auVar129 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ = fVar364 * fVar230;
    auVar35._0_4_ = fVar359 * fVar263;
    auVar35._8_4_ = fVar365 * fVar246;
    auVar35._12_4_ = fVar366 * fVar251;
    auVar35._16_4_ = fVar367 * fVar260;
    auVar35._20_4_ = fVar368 * fVar275;
    auVar35._24_4_ = fVar369 * fVar297;
    auVar35._28_4_ = uVar87;
    auVar36._4_4_ = fVar292 * fVar142;
    auVar36._0_4_ = fVar281 * fVar322;
    auVar36._8_4_ = fVar296 * fVar337;
    auVar36._12_4_ = fVar300 * fVar234;
    auVar36._16_4_ = fVar304 * fVar257;
    auVar36._20_4_ = fVar308 * fVar272;
    auVar36._24_4_ = fVar312 * fVar289;
    auVar36._28_4_ = local_9c0._28_4_;
    auVar285 = vsubps_avx(auVar36,auVar35);
    fVar315 = auVar285._28_4_;
    fVar278 = auVar129._28_4_ + fVar315;
    auVar37._4_4_ =
         (auVar25._4_4_ * auVar25._4_4_ +
         auVar26._4_4_ * auVar26._4_4_ + auVar107._4_4_ * auVar107._4_4_) * fVar254;
    auVar37._0_4_ =
         (auVar25._0_4_ * auVar25._0_4_ +
         auVar26._0_4_ * auVar26._0_4_ + auVar107._0_4_ * auVar107._0_4_) * fVar233;
    auVar37._8_4_ =
         (auVar25._8_4_ * auVar25._8_4_ +
         auVar26._8_4_ * auVar26._8_4_ + auVar107._8_4_ * auVar107._8_4_) * fVar255;
    auVar37._12_4_ =
         (auVar25._12_4_ * auVar25._12_4_ +
         auVar26._12_4_ * auVar26._12_4_ + auVar107._12_4_ * auVar107._12_4_) * fVar261;
    auVar37._16_4_ =
         (auVar25._16_4_ * auVar25._16_4_ +
         auVar26._16_4_ * auVar26._16_4_ + auVar107._16_4_ * auVar107._16_4_) * fVar264;
    auVar37._20_4_ =
         (auVar25._20_4_ * auVar25._20_4_ +
         auVar26._20_4_ * auVar26._20_4_ + auVar107._20_4_ * auVar107._20_4_) * fVar270;
    auVar37._24_4_ =
         (auVar25._24_4_ * auVar25._24_4_ +
         auVar26._24_4_ * auVar26._24_4_ + auVar107._24_4_ * auVar107._24_4_) * fVar276;
    auVar37._28_4_ = auVar25._28_4_ + fVar229;
    auVar38._4_4_ =
         (auVar27._4_4_ * auVar27._4_4_ +
         auVar129._4_4_ * auVar129._4_4_ + auVar285._4_4_ * auVar285._4_4_) * fVar254;
    auVar38._0_4_ =
         (auVar27._0_4_ * auVar27._0_4_ +
         auVar129._0_4_ * auVar129._0_4_ + auVar285._0_4_ * auVar285._0_4_) * fVar233;
    auVar38._8_4_ =
         (auVar27._8_4_ * auVar27._8_4_ +
         auVar129._8_4_ * auVar129._8_4_ + auVar285._8_4_ * auVar285._8_4_) * fVar255;
    auVar38._12_4_ =
         (auVar27._12_4_ * auVar27._12_4_ +
         auVar129._12_4_ * auVar129._12_4_ + auVar285._12_4_ * auVar285._12_4_) * fVar261;
    auVar38._16_4_ =
         (auVar27._16_4_ * auVar27._16_4_ +
         auVar129._16_4_ * auVar129._16_4_ + auVar285._16_4_ * auVar285._16_4_) * fVar264;
    auVar38._20_4_ =
         (auVar27._20_4_ * auVar27._20_4_ +
         auVar129._20_4_ * auVar129._20_4_ + auVar285._20_4_ * auVar285._20_4_) * fVar270;
    auVar38._24_4_ =
         (auVar27._24_4_ * auVar27._24_4_ +
         auVar129._24_4_ * auVar129._24_4_ + auVar285._24_4_ * auVar285._24_4_) * fVar276;
    auVar38._28_4_ = auVar186._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar37,auVar38);
    auVar129 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar129 = vshufps_avx(auVar129,_local_ae0,0x30);
    auVar26 = vshufps_avx(_local_ae0,auVar129,0x29);
    local_660._0_4_ = (float)local_ae0._0_4_ + fVar231;
    local_660._4_4_ = (float)local_ae0._4_4_ + fVar248;
    local_660._8_4_ = fStack_ad8 + fVar249;
    local_660._12_4_ = fStack_ad4 + fVar209;
    local_660._16_4_ = fStack_ad0 + fVar269;
    local_660._20_4_ = fStack_acc + fVar271;
    local_660._24_4_ = fStack_ac8 + fVar273;
    local_660._28_4_ = fStack_ac4 + fVar252;
    auVar129 = vmaxps_avx(_local_ae0,local_660);
    local_8e0 = auVar26;
    auVar25 = vmaxps_avx(_local_7c0,auVar26);
    auVar129 = vmaxps_avx(auVar129,auVar25);
    auVar25 = vrsqrtps_avx(auVar185);
    fVar269 = auVar25._0_4_;
    fVar271 = auVar25._4_4_;
    fVar273 = auVar25._8_4_;
    fVar209 = auVar25._12_4_;
    fVar229 = auVar25._16_4_;
    fVar231 = auVar25._20_4_;
    fVar248 = auVar25._24_4_;
    auVar39._4_4_ = fVar271 * fVar271 * fVar271 * auVar185._4_4_ * 0.5;
    auVar39._0_4_ = fVar269 * fVar269 * fVar269 * auVar185._0_4_ * 0.5;
    auVar39._8_4_ = fVar273 * fVar273 * fVar273 * auVar185._8_4_ * 0.5;
    auVar39._12_4_ = fVar209 * fVar209 * fVar209 * auVar185._12_4_ * 0.5;
    auVar39._16_4_ = fVar229 * fVar229 * fVar229 * auVar185._16_4_ * 0.5;
    auVar39._20_4_ = fVar231 * fVar231 * fVar231 * auVar185._20_4_ * 0.5;
    auVar39._24_4_ = fVar248 * fVar248 * fVar248 * auVar185._24_4_ * 0.5;
    auVar39._28_4_ = auVar185._28_4_;
    auVar40._4_4_ = fVar271 * 1.5;
    auVar40._0_4_ = fVar269 * 1.5;
    auVar40._8_4_ = fVar273 * 1.5;
    auVar40._12_4_ = fVar209 * 1.5;
    auVar40._16_4_ = fVar229 * 1.5;
    auVar40._20_4_ = fVar231 * 1.5;
    auVar40._24_4_ = fVar248 * 1.5;
    auVar40._28_4_ = auVar25._28_4_;
    local_520 = vsubps_avx(auVar40,auVar39);
    auVar73._4_4_ = fVar290;
    auVar73._0_4_ = fVar279;
    auVar73._8_4_ = fVar294;
    auVar73._12_4_ = fVar298;
    auVar73._16_4_ = fVar302;
    auVar73._20_4_ = fVar306;
    auVar73._24_4_ = fVar310;
    auVar73._28_4_ = fVar314;
    local_740 = vsubps_avx(ZEXT832(0) << 0x20,auVar73);
    auVar107 = vsubps_avx(ZEXT832(0) << 0x20,auVar77);
    fVar373 = auVar107._0_4_;
    fVar375 = auVar107._4_4_;
    fVar376 = auVar107._8_4_;
    fVar377 = auVar107._12_4_;
    fVar378 = auVar107._16_4_;
    fVar379 = auVar107._20_4_;
    fVar380 = auVar107._24_4_;
    fVar269 = local_740._0_4_;
    fVar209 = local_740._4_4_;
    fVar248 = local_740._8_4_;
    fVar252 = local_740._12_4_;
    fVar261 = local_740._16_4_;
    fVar276 = local_740._20_4_;
    fVar301 = local_740._24_4_;
    auVar285 = ZEXT832(0) << 0x20;
    auVar107 = vsubps_avx(auVar285,auVar74);
    fVar271 = auVar107._0_4_;
    fVar229 = auVar107._4_4_;
    fVar249 = auVar107._8_4_;
    fVar254 = auVar107._12_4_;
    fVar264 = auVar107._16_4_;
    fVar277 = auVar107._20_4_;
    fVar305 = auVar107._24_4_;
    auVar318._0_4_ = local_620 * fVar271 + local_640 * fVar269 + fVar373 * local_780;
    auVar318._4_4_ = fStack_61c * fVar229 + fStack_63c * fVar209 + fVar375 * fStack_77c;
    auVar318._8_4_ = fStack_618 * fVar249 + fStack_638 * fVar248 + fVar376 * fStack_778;
    auVar318._12_4_ = fStack_614 * fVar254 + fStack_634 * fVar252 + fVar377 * fStack_774;
    auVar318._16_4_ = fStack_610 * fVar264 + fStack_630 * fVar261 + fVar378 * fStack_770;
    auVar318._20_4_ = fStack_60c * fVar277 + fStack_62c * fVar276 + fVar379 * fStack_76c;
    auVar318._24_4_ = fStack_608 * fVar305 + fStack_628 * fVar301 + fVar380 * fStack_768;
    auVar318._28_4_ = fVar278 + auVar27._28_4_ + fVar278 + auVar25._28_4_;
    auVar328._0_4_ = fVar271 * fVar271 + fVar269 * fVar269 + fVar373 * fVar373;
    auVar328._4_4_ = fVar229 * fVar229 + fVar209 * fVar209 + fVar375 * fVar375;
    auVar328._8_4_ = fVar249 * fVar249 + fVar248 * fVar248 + fVar376 * fVar376;
    auVar328._12_4_ = fVar254 * fVar254 + fVar252 * fVar252 + fVar377 * fVar377;
    auVar328._16_4_ = fVar264 * fVar264 + fVar261 * fVar261 + fVar378 * fVar378;
    auVar328._20_4_ = fVar277 * fVar277 + fVar276 * fVar276 + fVar379 * fVar379;
    auVar328._24_4_ = fVar305 * fVar305 + fVar301 * fVar301 + fVar380 * fVar380;
    auVar328._28_4_ = fVar315 + fVar315 + fVar278;
    fVar273 = local_520._0_4_;
    fVar231 = local_520._4_4_;
    fVar233 = local_520._8_4_;
    fVar255 = local_520._12_4_;
    fVar270 = local_520._16_4_;
    fVar278 = local_520._20_4_;
    fVar309 = local_520._24_4_;
    fVar313 = local_6e0._28_4_;
    local_540 = local_620 * fVar273 * fVar263 +
                fVar322 * fVar273 * local_640 + fVar273 * fVar323 * local_780;
    fStack_53c = fStack_61c * fVar231 * fVar230 +
                 fVar142 * fVar231 * fStack_63c + fVar231 * fVar210 * fStack_77c;
    fStack_538 = fStack_618 * fVar233 * fVar246 +
                 fVar337 * fVar233 * fStack_638 + fVar233 * fVar245 * fStack_778;
    fStack_534 = fStack_614 * fVar255 * fVar251 +
                 fVar234 * fVar255 * fStack_634 + fVar255 * fVar235 * fStack_774;
    fStack_530 = fStack_610 * fVar270 * fVar260 +
                 fVar257 * fVar270 * fStack_630 + fVar270 * fVar258 * fStack_770;
    fStack_52c = fStack_60c * fVar278 * fVar275 +
                 fVar272 * fVar278 * fStack_62c + fVar278 * fVar274 * fStack_76c;
    fStack_528 = fStack_608 * fVar309 * fVar297 +
                 fVar289 * fVar309 * fStack_628 + fVar309 * fVar293 * fStack_768;
    fVar315 = fStack_604 + fVar313 + fStack_764;
    local_560 = fVar271 * fVar273 * fVar263 +
                fVar322 * fVar273 * fVar269 + fVar373 * fVar273 * fVar323;
    fStack_55c = fVar229 * fVar231 * fVar230 +
                 fVar142 * fVar231 * fVar209 + fVar375 * fVar231 * fVar210;
    fStack_558 = fVar249 * fVar233 * fVar246 +
                 fVar337 * fVar233 * fVar248 + fVar376 * fVar233 * fVar245;
    fStack_554 = fVar254 * fVar255 * fVar251 +
                 fVar234 * fVar255 * fVar252 + fVar377 * fVar255 * fVar235;
    fStack_550 = fVar264 * fVar270 * fVar260 +
                 fVar257 * fVar270 * fVar261 + fVar378 * fVar270 * fVar258;
    fStack_54c = fVar277 * fVar278 * fVar275 +
                 fVar272 * fVar278 * fVar276 + fVar379 * fVar278 * fVar274;
    fStack_548 = fVar305 * fVar309 * fVar297 +
                 fVar289 * fVar309 * fVar301 + fVar380 * fVar309 * fVar293;
    fStack_544 = fVar313 + fVar315;
    auVar41._4_4_ = fStack_53c * fStack_55c;
    auVar41._0_4_ = local_540 * local_560;
    auVar41._8_4_ = fStack_538 * fStack_558;
    auVar41._12_4_ = fStack_534 * fStack_554;
    auVar41._16_4_ = fStack_530 * fStack_550;
    auVar41._20_4_ = fStack_52c * fStack_54c;
    auVar41._24_4_ = fStack_528 * fStack_548;
    auVar41._28_4_ = fVar315;
    auVar25 = vsubps_avx(auVar318,auVar41);
    auVar42._4_4_ = fStack_55c * fStack_55c;
    auVar42._0_4_ = local_560 * local_560;
    auVar42._8_4_ = fStack_558 * fStack_558;
    auVar42._12_4_ = fStack_554 * fStack_554;
    auVar42._16_4_ = fStack_550 * fStack_550;
    auVar42._20_4_ = fStack_54c * fStack_54c;
    auVar42._24_4_ = fStack_548 * fStack_548;
    auVar42._28_4_ = fVar313;
    local_680 = vsubps_avx(auVar328,auVar42);
    local_6c0 = vsqrtps_avx(auVar105);
    fVar315 = (local_6c0._0_4_ + auVar129._0_4_) * 1.0000002;
    fVar324 = (local_6c0._4_4_ + auVar129._4_4_) * 1.0000002;
    fVar358 = (local_6c0._8_4_ + auVar129._8_4_) * 1.0000002;
    fVar114 = (local_6c0._12_4_ + auVar129._12_4_) * 1.0000002;
    fVar115 = (local_6c0._16_4_ + auVar129._16_4_) * 1.0000002;
    fVar116 = (local_6c0._20_4_ + auVar129._20_4_) * 1.0000002;
    fVar117 = (local_6c0._24_4_ + auVar129._24_4_) * 1.0000002;
    auVar43._4_4_ = fVar324 * fVar324;
    auVar43._0_4_ = fVar315 * fVar315;
    auVar43._8_4_ = fVar358 * fVar358;
    auVar43._12_4_ = fVar114 * fVar114;
    auVar43._16_4_ = fVar115 * fVar115;
    auVar43._20_4_ = fVar116 * fVar116;
    auVar43._24_4_ = fVar117 * fVar117;
    auVar43._28_4_ = local_6c0._28_4_ + auVar129._28_4_;
    local_8c0._0_4_ = auVar25._0_4_ + auVar25._0_4_;
    local_8c0._4_4_ = auVar25._4_4_ + auVar25._4_4_;
    local_8c0._8_4_ = auVar25._8_4_ + auVar25._8_4_;
    local_8c0._12_4_ = auVar25._12_4_ + auVar25._12_4_;
    local_8c0._16_4_ = auVar25._16_4_ + auVar25._16_4_;
    local_8c0._20_4_ = auVar25._20_4_ + auVar25._20_4_;
    local_8c0._24_4_ = auVar25._24_4_ + auVar25._24_4_;
    fVar315 = auVar25._28_4_;
    local_8c0._28_4_ = fVar315 + fVar315;
    auVar25 = vsubps_avx(local_680,auVar43);
    auVar44._4_4_ = fStack_53c * fStack_53c;
    auVar44._0_4_ = local_540 * local_540;
    auVar44._8_4_ = fStack_538 * fStack_538;
    auVar44._12_4_ = fStack_534 * fStack_534;
    auVar44._16_4_ = fStack_530 * fStack_530;
    auVar44._20_4_ = fStack_52c * fStack_52c;
    auVar44._24_4_ = fStack_528 * fStack_528;
    auVar44._28_4_ = fVar315;
    auVar363 = ZEXT3264(local_2a0);
    auVar105 = vsubps_avx(local_2a0,auVar44);
    local_7e0._4_4_ = local_8c0._4_4_ * local_8c0._4_4_;
    local_7e0._0_4_ = (float)local_8c0._0_4_ * (float)local_8c0._0_4_;
    local_7e0._8_4_ = local_8c0._8_4_ * local_8c0._8_4_;
    local_7e0._12_4_ = local_8c0._12_4_ * local_8c0._12_4_;
    local_7e0._16_4_ = local_8c0._16_4_ * local_8c0._16_4_;
    local_7e0._20_4_ = local_8c0._20_4_ * local_8c0._20_4_;
    local_7e0._24_4_ = local_8c0._24_4_ * local_8c0._24_4_;
    local_7e0._28_4_ = 0x3f800002;
    fVar315 = auVar105._0_4_;
    local_6a0._0_4_ = fVar315 * 4.0;
    fVar324 = auVar105._4_4_;
    local_6a0._4_4_ = fVar324 * 4.0;
    fVar358 = auVar105._8_4_;
    fStack_698 = fVar358 * 4.0;
    fVar114 = auVar105._12_4_;
    fStack_694 = fVar114 * 4.0;
    fVar115 = auVar105._16_4_;
    fStack_690 = fVar115 * 4.0;
    fVar116 = auVar105._20_4_;
    fStack_68c = fVar116 * 4.0;
    fVar117 = auVar105._24_4_;
    fStack_688 = fVar117 * 4.0;
    uStack_684 = 0x40800000;
    auVar45._4_4_ = auVar25._4_4_ * (float)local_6a0._4_4_;
    auVar45._0_4_ = auVar25._0_4_ * (float)local_6a0._0_4_;
    auVar45._8_4_ = auVar25._8_4_ * fStack_698;
    auVar45._12_4_ = auVar25._12_4_ * fStack_694;
    auVar45._16_4_ = auVar25._16_4_ * fStack_690;
    auVar45._20_4_ = auVar25._20_4_ * fStack_68c;
    auVar45._24_4_ = auVar25._24_4_ * fStack_688;
    auVar45._28_4_ = 0x40800000;
    auVar186 = vsubps_avx(local_7e0,auVar45);
    auVar129 = vcmpps_avx(auVar186,auVar285,5);
    auVar267._8_4_ = 0x7fffffff;
    auVar267._0_8_ = 0x7fffffff7fffffff;
    auVar267._12_4_ = 0x7fffffff;
    auVar267._16_4_ = 0x7fffffff;
    auVar267._20_4_ = 0x7fffffff;
    auVar267._24_4_ = 0x7fffffff;
    auVar267._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar44,auVar267);
    local_320._0_4_ = fVar315 + fVar315;
    local_320._4_4_ = fVar324 + fVar324;
    local_320._8_4_ = fVar358 + fVar358;
    local_320._12_4_ = fVar114 + fVar114;
    local_320._16_4_ = fVar115 + fVar115;
    local_320._20_4_ = fVar116 + fVar116;
    local_320._24_4_ = fVar117 + fVar117;
    local_320._28_4_ = auVar105._28_4_ + auVar105._28_4_;
    auVar105 = vandps_avx(auVar105,auVar267);
    uVar84 = CONCAT44(local_8c0._4_4_,local_8c0._0_4_);
    local_300._0_8_ = uVar84 ^ 0x8000000080000000;
    local_300._8_4_ = -local_8c0._8_4_;
    local_300._12_4_ = -local_8c0._12_4_;
    local_300._16_4_ = -local_8c0._16_4_;
    local_300._20_4_ = -local_8c0._20_4_;
    local_300._24_4_ = -local_8c0._24_4_;
    local_300._28_4_ = -local_8c0._28_4_;
    auVar189 = auVar129;
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar129 >> 0x7f,0) == '\0') &&
          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar129 >> 0xbf,0) == '\0') &&
        (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar129[0x1f])
    {
      auVar319._8_4_ = 0x7f800000;
      auVar319._0_8_ = 0x7f8000007f800000;
      auVar319._12_4_ = 0x7f800000;
      auVar319._16_4_ = 0x7f800000;
      auVar319._20_4_ = 0x7f800000;
      auVar319._24_4_ = 0x7f800000;
      auVar319._28_4_ = 0x7f800000;
      auVar106._8_4_ = 0xff800000;
      auVar106._0_8_ = 0xff800000ff800000;
      auVar106._12_4_ = 0xff800000;
      auVar106._16_4_ = 0xff800000;
      auVar106._20_4_ = 0xff800000;
      auVar106._24_4_ = 0xff800000;
      auVar106._28_4_ = 0xff800000;
    }
    else {
      auVar24 = vsqrtps_avx(auVar186);
      auVar28 = vrcpps_avx(local_320);
      auVar27 = vcmpps_avx(auVar186,auVar285,5);
      auVar363 = ZEXT3264(auVar27);
      fVar315 = auVar28._0_4_;
      fVar324 = auVar28._4_4_;
      auVar46._4_4_ = local_320._4_4_ * fVar324;
      auVar46._0_4_ = local_320._0_4_ * fVar315;
      fVar358 = auVar28._8_4_;
      auVar46._8_4_ = local_320._8_4_ * fVar358;
      fVar114 = auVar28._12_4_;
      auVar46._12_4_ = local_320._12_4_ * fVar114;
      fVar115 = auVar28._16_4_;
      auVar46._16_4_ = local_320._16_4_ * fVar115;
      fVar116 = auVar28._20_4_;
      auVar46._20_4_ = local_320._20_4_ * fVar116;
      fVar117 = auVar28._24_4_;
      auVar46._24_4_ = local_320._24_4_ * fVar117;
      auVar46._28_4_ = auVar186._28_4_;
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = 0x3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
      auVar186 = vsubps_avx(auVar131,auVar46);
      fVar315 = fVar315 + fVar315 * auVar186._0_4_;
      fVar324 = fVar324 + fVar324 * auVar186._4_4_;
      fVar358 = fVar358 + fVar358 * auVar186._8_4_;
      fVar114 = fVar114 + fVar114 * auVar186._12_4_;
      fVar115 = fVar115 + fVar115 * auVar186._16_4_;
      fVar116 = fVar116 + fVar116 * auVar186._20_4_;
      fVar117 = fVar117 + fVar117 * auVar186._24_4_;
      auVar285 = vsubps_avx(local_300,auVar24);
      fVar236 = auVar285._0_4_ * fVar315;
      fVar247 = auVar285._4_4_ * fVar324;
      auVar47._4_4_ = fVar247;
      auVar47._0_4_ = fVar236;
      fVar250 = auVar285._8_4_ * fVar358;
      auVar47._8_4_ = fVar250;
      fVar253 = auVar285._12_4_ * fVar114;
      auVar47._12_4_ = fVar253;
      fVar256 = auVar285._16_4_ * fVar115;
      auVar47._16_4_ = fVar256;
      fVar259 = auVar285._20_4_ * fVar116;
      auVar47._20_4_ = fVar259;
      fVar262 = auVar285._24_4_ * fVar117;
      auVar47._24_4_ = fVar262;
      auVar47._28_4_ = auVar285._28_4_;
      auVar285 = vsubps_avx(auVar24,local_8c0);
      fVar315 = auVar285._0_4_ * fVar315;
      fVar324 = auVar285._4_4_ * fVar324;
      auVar48._4_4_ = fVar324;
      auVar48._0_4_ = fVar315;
      fVar358 = auVar285._8_4_ * fVar358;
      auVar48._8_4_ = fVar358;
      fVar114 = auVar285._12_4_ * fVar114;
      auVar48._12_4_ = fVar114;
      fVar115 = auVar285._16_4_ * fVar115;
      auVar48._16_4_ = fVar115;
      fVar116 = auVar285._20_4_ * fVar116;
      auVar48._20_4_ = fVar116;
      fVar117 = auVar285._24_4_ * fVar117;
      auVar48._24_4_ = fVar117;
      auVar48._28_4_ = auVar28._28_4_ + auVar186._28_4_;
      local_380 = fVar273 * (local_560 + local_540 * fVar236);
      fStack_37c = fVar231 * (fStack_55c + fStack_53c * fVar247);
      fStack_378 = fVar233 * (fStack_558 + fStack_538 * fVar250);
      fStack_374 = fVar255 * (fStack_554 + fStack_534 * fVar253);
      fStack_370 = fVar270 * (fStack_550 + fStack_530 * fVar256);
      fStack_36c = fVar278 * (fStack_54c + fStack_52c * fVar259);
      fStack_368 = fVar309 * (fStack_548 + fStack_528 * fVar262);
      fStack_364 = local_320._28_4_;
      local_360 = fVar273 * (local_560 + local_540 * fVar315);
      fStack_35c = fVar231 * (fStack_55c + fStack_53c * fVar324);
      fStack_358 = fVar233 * (fStack_558 + fStack_538 * fVar358);
      fStack_354 = fVar255 * (fStack_554 + fStack_534 * fVar114);
      fStack_350 = fVar270 * (fStack_550 + fStack_530 * fVar115);
      fStack_34c = fVar278 * (fStack_54c + fStack_52c * fVar116);
      fStack_348 = fVar309 * (fStack_548 + fStack_528 * fVar117);
      fStack_344 = local_320._28_4_;
      auVar219._8_4_ = 0x7f800000;
      auVar219._0_8_ = 0x7f8000007f800000;
      auVar219._12_4_ = 0x7f800000;
      auVar219._16_4_ = 0x7f800000;
      auVar219._20_4_ = 0x7f800000;
      auVar219._24_4_ = 0x7f800000;
      auVar219._28_4_ = 0x7f800000;
      auVar319 = vblendvps_avx(auVar219,auVar47,auVar27);
      auVar220._8_4_ = 0xff800000;
      auVar220._0_8_ = 0xff800000ff800000;
      auVar220._12_4_ = 0xff800000;
      auVar220._16_4_ = 0xff800000;
      auVar220._20_4_ = 0xff800000;
      auVar220._24_4_ = 0xff800000;
      auVar220._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar220,auVar48,auVar27);
      auVar186 = vmaxps_avx(local_500,local_3a0);
      auVar49._4_4_ = auVar186._4_4_ * 1.9073486e-06;
      auVar49._0_4_ = auVar186._0_4_ * 1.9073486e-06;
      auVar49._8_4_ = auVar186._8_4_ * 1.9073486e-06;
      auVar49._12_4_ = auVar186._12_4_ * 1.9073486e-06;
      auVar49._16_4_ = auVar186._16_4_ * 1.9073486e-06;
      auVar49._20_4_ = auVar186._20_4_ * 1.9073486e-06;
      auVar49._24_4_ = auVar186._24_4_ * 1.9073486e-06;
      auVar49._28_4_ = auVar186._28_4_;
      auVar186 = vcmpps_avx(auVar105,auVar49,1);
      auVar285 = auVar27 & auVar186;
      if ((((((((auVar285 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar285 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar285 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar285 >> 0x7f,0) != '\0') ||
            (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar285 >> 0xbf,0) != '\0') ||
          (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar285[0x1f] < '\0') {
        auVar129 = vandps_avx(auVar186,auVar27);
        auVar176 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
        auVar186 = vcmpps_avx(auVar25,_DAT_01f7b000,2);
        auVar189._8_4_ = 0xff800000;
        auVar189._0_8_ = 0xff800000ff800000;
        auVar189._12_4_ = 0xff800000;
        auVar189._16_4_ = 0xff800000;
        auVar189._20_4_ = 0xff800000;
        auVar189._24_4_ = 0xff800000;
        auVar189._28_4_ = 0xff800000;
        auVar344._8_4_ = 0x7f800000;
        auVar344._0_8_ = 0x7f8000007f800000;
        auVar344._12_4_ = 0x7f800000;
        auVar344._16_4_ = 0x7f800000;
        auVar344._20_4_ = 0x7f800000;
        auVar344._24_4_ = 0x7f800000;
        auVar344._28_4_ = 0x7f800000;
        auVar25 = vblendvps_avx(auVar344,auVar189,auVar186);
        auVar20 = vpmovsxwd_avx(auVar176);
        auVar176 = vpunpckhwd_avx(auVar176,auVar176);
        auVar227._16_16_ = auVar176;
        auVar227._0_16_ = auVar20;
        auVar319 = vblendvps_avx(auVar319,auVar25,auVar227);
        auVar25 = vblendvps_avx(auVar189,auVar344,auVar186);
        auVar106 = vblendvps_avx(auVar106,auVar25,auVar227);
        auVar163._0_8_ = auVar129._0_8_ ^ 0xffffffffffffffff;
        auVar163._8_4_ = auVar129._8_4_ ^ 0xffffffff;
        auVar163._12_4_ = auVar129._12_4_ ^ 0xffffffff;
        auVar163._16_4_ = auVar129._16_4_ ^ 0xffffffff;
        auVar163._20_4_ = auVar129._20_4_ ^ 0xffffffff;
        auVar163._24_4_ = auVar129._24_4_ ^ 0xffffffff;
        auVar163._28_4_ = auVar129._28_4_ ^ 0xffffffff;
        auVar129 = vorps_avx(auVar186,auVar163);
        auVar129 = vandps_avx(auVar27,auVar129);
      }
    }
    auVar19._4_4_ = fStack_77c;
    auVar19._0_4_ = local_780;
    auVar19._8_4_ = fStack_778;
    auVar19._12_4_ = fStack_774;
    auVar19._16_4_ = fStack_770;
    auVar19._20_4_ = fStack_76c;
    auVar19._24_4_ = fStack_768;
    auVar19._28_4_ = fStack_764;
    auVar268 = ZEXT3264(local_340);
    auVar25 = local_340 & auVar129;
    local_8e0._0_8_ = uVar83;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0x7f,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar25 >> 0xbf,0) == '\0') &&
        (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f]) {
LAB_008c2795:
      auVar345 = ZEXT3264(auVar19);
      auVar320 = ZEXT3264(auVar319);
    }
    else {
      fStack_524 = fStack_604 + fVar313 + fStack_764;
      auVar176 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_840._0_4_));
      auVar176 = vshufps_avx(auVar176,auVar176,0);
      auVar221._16_16_ = auVar176;
      auVar221._0_16_ = auVar176;
      local_820 = vmaxps_avx(auVar221,auVar319);
      auVar176 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_840._0_4_));
      auVar176 = vshufps_avx(auVar176,auVar176,0);
      auVar222._16_16_ = auVar176;
      auVar222._0_16_ = auVar176;
      auVar27 = vminps_avx(auVar222,auVar106);
      fVar117 = auVar107._28_4_;
      auVar319._4_4_ = fStack_63c;
      auVar319._0_4_ = local_640;
      auVar319._8_4_ = fStack_638;
      auVar319._12_4_ = fStack_634;
      auVar319._16_4_ = fStack_630;
      auVar319._20_4_ = fStack_62c;
      auVar319._24_4_ = fStack_628;
      auVar319._28_4_ = fStack_624;
      auVar132._0_4_ = local_620 * fVar280 + local_640 * fVar326 + local_780 * fVar338;
      auVar132._4_4_ = fStack_61c * fVar291 + fStack_63c * fVar331 + fStack_77c * fVar346;
      auVar132._8_4_ = fStack_618 * fVar295 + fStack_638 * fVar332 + fStack_778 * fVar348;
      auVar132._12_4_ = fStack_614 * fVar299 + fStack_634 * fVar333 + fStack_774 * fVar350;
      auVar132._16_4_ = fStack_610 * fVar303 + fStack_630 * fVar334 + fStack_770 * fVar352;
      auVar132._20_4_ = fStack_60c * fVar307 + fStack_62c * fVar335 + fStack_76c * fVar354;
      auVar132._24_4_ = fStack_608 * fVar311 + fStack_628 * fVar336 + fStack_768 * fVar356;
      auVar132._28_4_ = fVar117 + fVar117 + fStack_204;
      auVar25 = vrcpps_avx(auVar132);
      fVar315 = auVar25._0_4_;
      fVar313 = auVar25._4_4_;
      auVar50._4_4_ = auVar132._4_4_ * fVar313;
      auVar50._0_4_ = auVar132._0_4_ * fVar315;
      fVar324 = auVar25._8_4_;
      auVar50._8_4_ = auVar132._8_4_ * fVar324;
      fVar358 = auVar25._12_4_;
      auVar50._12_4_ = auVar132._12_4_ * fVar358;
      fVar114 = auVar25._16_4_;
      auVar50._16_4_ = auVar132._16_4_ * fVar114;
      fVar115 = auVar25._20_4_;
      auVar50._20_4_ = auVar132._20_4_ * fVar115;
      fVar116 = auVar25._24_4_;
      auVar50._24_4_ = auVar132._24_4_ * fVar116;
      auVar50._28_4_ = fStack_844 + fVar325;
      auVar370._8_4_ = 0x3f800000;
      auVar370._0_8_ = 0x3f8000003f800000;
      auVar370._12_4_ = 0x3f800000;
      auVar370._16_4_ = 0x3f800000;
      auVar370._20_4_ = 0x3f800000;
      auVar370._24_4_ = 0x3f800000;
      auVar370._28_4_ = 0x3f800000;
      auVar107 = vsubps_avx(auVar370,auVar50);
      auVar286._8_4_ = 0x7fffffff;
      auVar286._0_8_ = 0x7fffffff7fffffff;
      auVar286._12_4_ = 0x7fffffff;
      auVar286._16_4_ = 0x7fffffff;
      auVar286._20_4_ = 0x7fffffff;
      auVar286._24_4_ = 0x7fffffff;
      auVar286._28_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar286,auVar132);
      auVar381._8_4_ = 0x219392ef;
      auVar381._0_8_ = 0x219392ef219392ef;
      auVar381._12_4_ = 0x219392ef;
      auVar381._16_4_ = 0x219392ef;
      auVar381._20_4_ = 0x219392ef;
      auVar381._24_4_ = 0x219392ef;
      auVar381._28_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar25,auVar381,1);
      auVar51._4_4_ =
           (fVar313 + fVar313 * auVar107._4_4_) *
           -(fVar291 * fVar229 + fVar331 * fVar209 + fVar375 * fVar346);
      auVar51._0_4_ =
           (fVar315 + fVar315 * auVar107._0_4_) *
           -(fVar280 * fVar271 + fVar326 * fVar269 + fVar373 * fVar338);
      auVar51._8_4_ =
           (fVar324 + fVar324 * auVar107._8_4_) *
           -(fVar295 * fVar249 + fVar332 * fVar248 + fVar376 * fVar348);
      auVar51._12_4_ =
           (fVar358 + fVar358 * auVar107._12_4_) *
           -(fVar299 * fVar254 + fVar333 * fVar252 + fVar377 * fVar350);
      auVar51._16_4_ =
           (fVar114 + fVar114 * auVar107._16_4_) *
           -(fVar303 * fVar264 + fVar334 * fVar261 + fVar378 * fVar352);
      auVar51._20_4_ =
           (fVar115 + fVar115 * auVar107._20_4_) *
           -(fVar307 * fVar277 + fVar335 * fVar276 + fVar379 * fVar354);
      auVar51._24_4_ =
           (fVar116 + fVar116 * auVar107._24_4_) *
           -(fVar311 * fVar305 + fVar336 * fVar301 + fVar380 * fVar356);
      auVar51._28_4_ = -(fVar117 + auVar189._28_4_ + auVar176._12_4_);
      auVar107 = vcmpps_avx(auVar132,ZEXT832(0) << 0x40,1);
      auVar186 = vorps_avx(auVar25,auVar107);
      auVar107 = vcmpps_avx(auVar132,ZEXT832(0) << 0x40,6);
      auVar107 = vorps_avx(auVar25,auVar107);
      auVar362._8_4_ = 0xff800000;
      auVar362._0_8_ = 0xff800000ff800000;
      auVar362._12_4_ = 0xff800000;
      auVar362._16_4_ = 0xff800000;
      auVar362._20_4_ = 0xff800000;
      auVar362._24_4_ = 0xff800000;
      auVar362._28_4_ = 0xff800000;
      auVar363 = ZEXT3264(auVar362);
      auVar25 = vblendvps_avx(auVar51,auVar362,auVar186);
      auVar374._8_4_ = 0x7f800000;
      auVar374._0_8_ = 0x7f8000007f800000;
      auVar374._12_4_ = 0x7f800000;
      auVar374._16_4_ = 0x7f800000;
      auVar374._20_4_ = 0x7f800000;
      auVar374._24_4_ = 0x7f800000;
      auVar374._28_4_ = 0x7f800000;
      auVar107 = vblendvps_avx(auVar51,auVar374,auVar107);
      auVar186 = vmaxps_avx(local_820,auVar25);
      auVar19 = vminps_avx(auVar27,auVar107);
      auVar107 = ZEXT832(0) << 0x40;
      auVar25 = vsubps_avx(auVar107,auVar23);
      auVar23 = vsubps_avx(auVar107,local_8a0);
      auVar52._4_4_ = auVar23._4_4_ * -fVar347;
      auVar52._0_4_ = auVar23._0_4_ * -fVar339;
      auVar52._8_4_ = auVar23._8_4_ * -fVar349;
      auVar52._12_4_ = auVar23._12_4_ * -fVar351;
      auVar52._16_4_ = auVar23._16_4_ * -fVar353;
      auVar52._20_4_ = auVar23._20_4_ * -fVar355;
      auVar52._24_4_ = auVar23._24_4_ * -fVar357;
      auVar52._28_4_ = auVar23._28_4_;
      auVar53._4_4_ = fVar364 * auVar25._4_4_;
      auVar53._0_4_ = fVar359 * auVar25._0_4_;
      auVar53._8_4_ = fVar365 * auVar25._8_4_;
      auVar53._12_4_ = fVar366 * auVar25._12_4_;
      auVar53._16_4_ = fVar367 * auVar25._16_4_;
      auVar53._20_4_ = fVar368 * auVar25._20_4_;
      auVar53._24_4_ = fVar369 * auVar25._24_4_;
      auVar53._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar52,auVar53);
      auVar23 = vsubps_avx(auVar107,local_900);
      auVar54._4_4_ = fVar292 * auVar23._4_4_;
      auVar54._0_4_ = fVar281 * auVar23._0_4_;
      auVar54._8_4_ = fVar296 * auVar23._8_4_;
      auVar54._12_4_ = fVar300 * auVar23._12_4_;
      auVar54._16_4_ = fVar304 * auVar23._16_4_;
      auVar54._20_4_ = fVar308 * auVar23._20_4_;
      uVar90 = auVar23._28_4_;
      auVar54._24_4_ = fVar312 * auVar23._24_4_;
      auVar54._28_4_ = uVar90;
      auVar107 = vsubps_avx(auVar25,auVar54);
      auVar55._4_4_ = fStack_77c * -fVar347;
      auVar55._0_4_ = local_780 * -fVar339;
      auVar55._8_4_ = fStack_778 * -fVar349;
      auVar55._12_4_ = fStack_774 * -fVar351;
      auVar55._16_4_ = fStack_770 * -fVar353;
      auVar55._20_4_ = fStack_76c * -fVar355;
      auVar55._24_4_ = fStack_768 * -fVar357;
      auVar55._28_4_ = uVar87 ^ 0x80000000;
      auVar371._8_4_ = 0x3f800000;
      auVar371._0_8_ = 0x3f8000003f800000;
      auVar371._12_4_ = 0x3f800000;
      auVar371._16_4_ = 0x3f800000;
      auVar371._20_4_ = 0x3f800000;
      auVar371._24_4_ = 0x3f800000;
      auVar371._28_4_ = 0x3f800000;
      auVar56._4_4_ = fStack_63c * fVar364;
      auVar56._0_4_ = local_640 * fVar359;
      auVar56._8_4_ = fStack_638 * fVar365;
      auVar56._12_4_ = fStack_634 * fVar366;
      auVar56._16_4_ = fStack_630 * fVar367;
      auVar56._20_4_ = fStack_62c * fVar368;
      auVar56._24_4_ = fStack_628 * fVar369;
      auVar56._28_4_ = uVar90;
      auVar25 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fStack_61c * fVar292;
      auVar57._0_4_ = local_620 * fVar281;
      auVar57._8_4_ = fStack_618 * fVar296;
      auVar57._12_4_ = fStack_614 * fVar300;
      auVar57._16_4_ = fStack_610 * fVar304;
      auVar57._20_4_ = fStack_60c * fVar308;
      auVar57._24_4_ = fStack_608 * fVar312;
      auVar57._28_4_ = uVar90;
      auVar27 = vsubps_avx(auVar25,auVar57);
      auVar25 = vrcpps_avx(auVar27);
      fVar315 = auVar25._0_4_;
      fVar269 = auVar25._4_4_;
      auVar58._4_4_ = auVar27._4_4_ * fVar269;
      auVar58._0_4_ = auVar27._0_4_ * fVar315;
      fVar271 = auVar25._8_4_;
      auVar58._8_4_ = auVar27._8_4_ * fVar271;
      fVar209 = auVar25._12_4_;
      auVar58._12_4_ = auVar27._12_4_ * fVar209;
      fVar229 = auVar25._16_4_;
      auVar58._16_4_ = auVar27._16_4_ * fVar229;
      fVar248 = auVar25._20_4_;
      auVar58._20_4_ = auVar27._20_4_ * fVar248;
      fVar249 = auVar25._24_4_;
      auVar58._24_4_ = auVar27._24_4_ * fVar249;
      auVar58._28_4_ = fStack_604;
      auVar285 = vsubps_avx(auVar371,auVar58);
      auVar25 = vandps_avx(auVar286,auVar27);
      auVar108._8_4_ = 0x219392ef;
      auVar108._0_8_ = 0x219392ef219392ef;
      auVar108._12_4_ = 0x219392ef;
      auVar108._16_4_ = 0x219392ef;
      auVar108._20_4_ = 0x219392ef;
      auVar108._24_4_ = 0x219392ef;
      auVar108._28_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar25,auVar108,1);
      auVar59._4_4_ = (fVar269 + fVar269 * auVar285._4_4_) * -auVar107._4_4_;
      auVar59._0_4_ = (fVar315 + fVar315 * auVar285._0_4_) * -auVar107._0_4_;
      auVar59._8_4_ = (fVar271 + fVar271 * auVar285._8_4_) * -auVar107._8_4_;
      auVar59._12_4_ = (fVar209 + fVar209 * auVar285._12_4_) * -auVar107._12_4_;
      auVar59._16_4_ = (fVar229 + fVar229 * auVar285._16_4_) * -auVar107._16_4_;
      auVar59._20_4_ = (fVar248 + fVar248 * auVar285._20_4_) * -auVar107._20_4_;
      auVar59._24_4_ = (fVar249 + fVar249 * auVar285._24_4_) * -auVar107._24_4_;
      auVar59._28_4_ = auVar107._28_4_ ^ 0x80000000;
      auVar25 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,1);
      auVar25 = vorps_avx(auVar23,auVar25);
      auVar25 = vblendvps_avx(auVar59,auVar362,auVar25);
      local_820 = vmaxps_avx(auVar186,auVar25);
      auVar25 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,6);
      auVar25 = vorps_avx(auVar23,auVar25);
      auVar25 = vblendvps_avx(auVar59,auVar374,auVar25);
      auVar129 = vandps_avx(auVar129,local_340);
      local_5c0 = vminps_avx(auVar19,auVar25);
      auVar25 = vcmpps_avx(local_820,local_5c0,2);
      auVar23 = auVar129 & auVar25;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      goto LAB_008c2795;
      auVar23 = vminps_avx(_local_ae0,local_660);
      auVar107 = vminps_avx(_local_7c0,auVar26);
      auVar23 = vminps_avx(auVar23,auVar107);
      auVar23 = vsubps_avx(auVar23,local_6c0);
      auVar129 = vandps_avx(auVar25,auVar129);
      auVar78._4_4_ = fStack_37c;
      auVar78._0_4_ = local_380;
      auVar78._8_4_ = fStack_378;
      auVar78._12_4_ = fStack_374;
      auVar78._16_4_ = fStack_370;
      auVar78._20_4_ = fStack_36c;
      auVar78._24_4_ = fStack_368;
      auVar78._28_4_ = fStack_364;
      auVar25 = vminps_avx(auVar78,auVar371);
      auVar186 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
      fVar315 = DAT_01f7b060._28_4_;
      local_1a0[0] = fVar143 + fVar321 * (auVar25._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1a0[1] = fVar165 + fVar191 * (auVar25._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1a0[2] = fVar166 + fVar232 * (auVar25._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1a0[3] = fVar167 + fVar190 * (auVar25._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_190 = fVar143 + fVar321 * (auVar25._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_18c = fVar165 + fVar191 * (auVar25._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_188 = fVar166 + fVar232 * (auVar25._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_184 = fVar167 + auVar25._28_4_ + fVar315;
      auVar79._4_4_ = fStack_35c;
      auVar79._0_4_ = local_360;
      auVar79._8_4_ = fStack_358;
      auVar79._12_4_ = fStack_354;
      auVar79._16_4_ = fStack_350;
      auVar79._20_4_ = fStack_34c;
      auVar79._24_4_ = fStack_348;
      auVar79._28_4_ = fStack_344;
      auVar25 = vminps_avx(auVar79,auVar371);
      auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar143 + fVar321 * (auVar25._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1c0[1] = fVar165 + fVar191 * (auVar25._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1c0[2] = fVar166 + fVar232 * (auVar25._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1c0[3] = fVar167 + fVar190 * (auVar25._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_1b0 = fVar143 + fVar321 * (auVar25._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_1ac = fVar165 + fVar191 * (auVar25._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_1a8 = fVar166 + fVar232 * (auVar25._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_1a4 = fVar167 + auVar25._28_4_ + fVar315;
      auVar60._4_4_ = auVar23._4_4_ * 0.99999976;
      auVar60._0_4_ = auVar23._0_4_ * 0.99999976;
      auVar60._8_4_ = auVar23._8_4_ * 0.99999976;
      auVar60._12_4_ = auVar23._12_4_ * 0.99999976;
      auVar60._16_4_ = auVar23._16_4_ * 0.99999976;
      auVar60._20_4_ = auVar23._20_4_ * 0.99999976;
      auVar60._24_4_ = auVar23._24_4_ * 0.99999976;
      auVar60._28_4_ = 0x3f7ffffc;
      auVar25 = vmaxps_avx(ZEXT832(0) << 0x20,auVar60);
      auVar61._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar61._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar61._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar61._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar61._16_4_ = auVar25._16_4_ * auVar25._16_4_;
      auVar61._20_4_ = auVar25._20_4_ * auVar25._20_4_;
      auVar61._24_4_ = auVar25._24_4_ * auVar25._24_4_;
      auVar61._28_4_ = auVar25._28_4_;
      auVar23 = vsubps_avx(local_680,auVar61);
      auVar62._4_4_ = auVar23._4_4_ * (float)local_6a0._4_4_;
      auVar62._0_4_ = auVar23._0_4_ * (float)local_6a0._0_4_;
      auVar62._8_4_ = auVar23._8_4_ * fStack_698;
      auVar62._12_4_ = auVar23._12_4_ * fStack_694;
      auVar62._16_4_ = auVar23._16_4_ * fStack_690;
      auVar62._20_4_ = auVar23._20_4_ * fStack_68c;
      auVar62._24_4_ = auVar23._24_4_ * fStack_688;
      auVar62._28_4_ = auVar25._28_4_;
      auVar107 = vsubps_avx(local_7e0,auVar62);
      auVar25 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,5);
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0x7f,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0xbf,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f])
      {
        auVar242 = SUB3228(ZEXT832(0),0) << 0x40;
        auVar218 = ZEXT828(0) << 0x20;
        auVar203 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar268 = ZEXT864(0) << 0x20;
        auVar320 = ZEXT864(0) << 0x20;
        auVar287._8_4_ = 0x7f800000;
        auVar287._0_8_ = 0x7f8000007f800000;
        auVar287._12_4_ = 0x7f800000;
        auVar287._16_4_ = 0x7f800000;
        auVar287._20_4_ = 0x7f800000;
        auVar287._24_4_ = 0x7f800000;
        auVar287._28_4_ = 0x7f800000;
        auVar329._8_4_ = 0xff800000;
        auVar329._0_8_ = 0xff800000ff800000;
        auVar329._12_4_ = 0xff800000;
        auVar329._16_4_ = 0xff800000;
        auVar329._20_4_ = 0xff800000;
        auVar329._24_4_ = 0xff800000;
        auVar329._28_4_ = 0xff800000;
      }
      else {
        local_980 = auVar25;
        auVar186 = vrcpps_avx(local_320);
        fVar321 = auVar186._0_4_;
        fVar269 = auVar186._4_4_;
        auVar63._4_4_ = local_320._4_4_ * fVar269;
        auVar63._0_4_ = local_320._0_4_ * fVar321;
        fVar271 = auVar186._8_4_;
        auVar63._8_4_ = local_320._8_4_ * fVar271;
        fVar191 = auVar186._12_4_;
        auVar63._12_4_ = local_320._12_4_ * fVar191;
        fVar209 = auVar186._16_4_;
        auVar63._16_4_ = local_320._16_4_ * fVar209;
        fVar229 = auVar186._20_4_;
        auVar63._20_4_ = local_320._20_4_ * fVar229;
        fVar232 = auVar186._24_4_;
        auVar63._24_4_ = local_320._24_4_ * fVar232;
        auVar63._28_4_ = auVar23._28_4_;
        auVar285 = vsubps_avx(auVar371,auVar63);
        auVar27 = vsqrtps_avx(auVar107);
        fVar321 = fVar321 + fVar321 * auVar285._0_4_;
        fVar269 = fVar269 + fVar269 * auVar285._4_4_;
        fVar271 = fVar271 + fVar271 * auVar285._8_4_;
        fVar191 = fVar191 + fVar191 * auVar285._12_4_;
        fVar209 = fVar209 + fVar209 * auVar285._16_4_;
        fVar229 = fVar229 + fVar229 * auVar285._20_4_;
        fVar232 = fVar232 + fVar232 * auVar285._24_4_;
        auVar28 = vsubps_avx(local_300,auVar27);
        fVar276 = auVar28._0_4_ * fVar321;
        fVar277 = auVar28._4_4_ * fVar269;
        auVar64._4_4_ = fVar277;
        auVar64._0_4_ = fVar276;
        fVar301 = auVar28._8_4_ * fVar271;
        auVar64._8_4_ = fVar301;
        fVar305 = auVar28._12_4_ * fVar191;
        auVar64._12_4_ = fVar305;
        fVar313 = auVar28._16_4_ * fVar209;
        auVar64._16_4_ = fVar313;
        fVar324 = auVar28._20_4_ * fVar229;
        auVar64._20_4_ = fVar324;
        fVar358 = auVar28._24_4_ * fVar232;
        auVar64._24_4_ = fVar358;
        auVar64._28_4_ = 0x7f800000;
        auVar28 = vsubps_avx(auVar27,local_8c0);
        fVar321 = auVar28._0_4_ * fVar321;
        fVar269 = auVar28._4_4_ * fVar269;
        auVar65._4_4_ = fVar269;
        auVar65._0_4_ = fVar321;
        fVar271 = auVar28._8_4_ * fVar271;
        auVar65._8_4_ = fVar271;
        fVar191 = auVar28._12_4_ * fVar191;
        auVar65._12_4_ = fVar191;
        fVar209 = auVar28._16_4_ * fVar209;
        auVar65._16_4_ = fVar209;
        fVar229 = auVar28._20_4_ * fVar229;
        auVar65._20_4_ = fVar229;
        fVar232 = auVar28._24_4_ * fVar232;
        auVar65._24_4_ = fVar232;
        auVar65._28_4_ = 0x3f800000;
        fVar248 = (fVar276 * local_540 + local_560) * fVar273;
        fVar249 = (fVar277 * fStack_53c + fStack_55c) * fVar231;
        fVar190 = (fVar301 * fStack_538 + fStack_558) * fVar233;
        fVar252 = (fVar305 * fStack_534 + fStack_554) * fVar255;
        fVar254 = (fVar313 * fStack_530 + fStack_550) * fVar270;
        fVar261 = (fVar324 * fStack_52c + fStack_54c) * fVar278;
        fVar264 = (fVar358 * fStack_528 + fStack_548) * fVar309;
        auVar204._0_4_ = local_880 + fVar263 * fVar248;
        auVar204._4_4_ = fStack_87c + fVar230 * fVar249;
        auVar204._8_4_ = fStack_878 + fVar246 * fVar190;
        auVar204._12_4_ = fStack_874 + fVar251 * fVar252;
        auVar204._16_4_ = fStack_870 + fVar260 * fVar254;
        auVar204._20_4_ = fStack_86c + fVar275 * fVar261;
        auVar204._24_4_ = fStack_868 + fVar297 * fVar264;
        auVar204._28_4_ = fStack_864 + auVar28._28_4_;
        auVar66._4_4_ = fStack_61c * fVar277;
        auVar66._0_4_ = local_620 * fVar276;
        auVar66._8_4_ = fStack_618 * fVar301;
        auVar66._12_4_ = fStack_614 * fVar305;
        auVar66._16_4_ = fStack_610 * fVar313;
        auVar66._20_4_ = fStack_60c * fVar324;
        auVar66._24_4_ = fStack_608 * fVar358;
        auVar66._28_4_ = auVar27._28_4_;
        auVar28 = vsubps_avx(auVar66,auVar204);
        auVar223._0_4_ = fVar279 + fVar322 * fVar248;
        auVar223._4_4_ = fVar290 + fVar142 * fVar249;
        auVar223._8_4_ = fVar294 + fVar337 * fVar190;
        auVar223._12_4_ = fVar298 + fVar234 * fVar252;
        auVar223._16_4_ = fVar302 + fVar257 * fVar254;
        auVar223._20_4_ = fVar306 + fVar272 * fVar261;
        auVar223._24_4_ = fVar310 + fVar289 * fVar264;
        auVar223._28_4_ = fVar314 + auVar27._28_4_;
        auVar80._4_4_ = fStack_63c * fVar277;
        auVar80._0_4_ = local_640 * fVar276;
        auVar80._8_4_ = fStack_638 * fVar301;
        auVar80._12_4_ = fStack_634 * fVar305;
        auVar80._16_4_ = fStack_630 * fVar313;
        auVar80._20_4_ = fStack_62c * fVar324;
        auVar80._24_4_ = fStack_628 * fVar358;
        auVar80._28_4_ = fVar315;
        local_8a0 = vsubps_avx(auVar80,auVar223);
        auVar187._0_4_ = local_860 + fVar323 * fVar248;
        auVar187._4_4_ = fStack_85c + fVar210 * fVar249;
        auVar187._8_4_ = fStack_858 + fVar245 * fVar190;
        auVar187._12_4_ = aStack_854.w + fVar235 * fVar252;
        auVar187._16_4_ = fStack_850 + fVar258 * fVar254;
        auVar187._20_4_ = fStack_84c + fVar274 * fVar261;
        auVar187._24_4_ = fStack_848 + fVar293 * fVar264;
        auVar187._28_4_ = fStack_844 + auVar186._28_4_ + auVar285._28_4_ + fStack_544;
        auVar67._4_4_ = fStack_77c * fVar277;
        auVar67._0_4_ = local_780 * fVar276;
        auVar67._8_4_ = fStack_778 * fVar301;
        auVar67._12_4_ = fStack_774 * fVar305;
        auVar67._16_4_ = fStack_770 * fVar313;
        auVar67._20_4_ = fStack_76c * fVar324;
        auVar67._24_4_ = fStack_768 * fVar358;
        auVar67._28_4_ = auVar223._28_4_;
        local_9e0 = vsubps_avx(auVar67,auVar187);
        fVar273 = (fVar321 * local_540 + local_560) * fVar273;
        fVar231 = (fVar269 * fStack_53c + fStack_55c) * fVar231;
        fVar233 = (fVar271 * fStack_538 + fStack_558) * fVar233;
        fVar255 = (fVar191 * fStack_534 + fStack_554) * fVar255;
        fVar270 = (fVar209 * fStack_530 + fStack_550) * fVar270;
        fVar278 = (fVar229 * fStack_52c + fStack_54c) * fVar278;
        fVar309 = (fVar232 * fStack_528 + fStack_548) * fVar309;
        auVar188._0_4_ = local_880 + fVar263 * fVar273;
        auVar188._4_4_ = fStack_87c + fVar230 * fVar231;
        auVar188._8_4_ = fStack_878 + fVar246 * fVar233;
        auVar188._12_4_ = fStack_874 + fVar251 * fVar255;
        auVar188._16_4_ = fStack_870 + fVar260 * fVar270;
        auVar188._20_4_ = fStack_86c + fVar275 * fVar278;
        auVar188._24_4_ = fStack_868 + fVar297 * fVar309;
        auVar188._28_4_ = fStack_864 + local_9e0._28_4_ + fStack_544;
        auVar68._4_4_ = fStack_61c * fVar269;
        auVar68._0_4_ = local_620 * fVar321;
        auVar68._8_4_ = fStack_618 * fVar271;
        auVar68._12_4_ = fStack_614 * fVar191;
        auVar68._16_4_ = fStack_610 * fVar209;
        auVar68._20_4_ = fStack_60c * fVar229;
        auVar68._24_4_ = fStack_608 * fVar232;
        auVar68._28_4_ = fVar315;
        auVar186 = vsubps_avx(auVar68,auVar188);
        auVar243._0_4_ = fVar279 + fVar322 * fVar273;
        auVar243._4_4_ = fVar290 + fVar142 * fVar231;
        auVar243._8_4_ = fVar294 + fVar337 * fVar233;
        auVar243._12_4_ = fVar298 + fVar234 * fVar255;
        auVar243._16_4_ = fVar302 + fVar257 * fVar270;
        auVar243._20_4_ = fVar306 + fVar272 * fVar278;
        auVar243._24_4_ = fVar310 + fVar289 * fVar309;
        auVar243._28_4_ = fVar314 + fVar315;
        auVar69._4_4_ = fStack_63c * fVar269;
        auVar69._0_4_ = local_640 * fVar321;
        auVar69._8_4_ = fStack_638 * fVar271;
        auVar69._12_4_ = fStack_634 * fVar191;
        auVar69._16_4_ = fStack_630 * fVar209;
        auVar69._20_4_ = fStack_62c * fVar229;
        auVar69._24_4_ = fStack_628 * fVar232;
        auVar69._28_4_ = fStack_604;
        auVar27 = vsubps_avx(auVar69,auVar243);
        auVar242 = auVar27._0_28_;
        auVar224._0_4_ = local_860 + fVar323 * fVar273;
        auVar224._4_4_ = fStack_85c + fVar210 * fVar231;
        auVar224._8_4_ = fStack_858 + fVar245 * fVar233;
        auVar224._12_4_ = aStack_854.w + fVar235 * fVar255;
        auVar224._16_4_ = fStack_850 + fVar258 * fVar270;
        auVar224._20_4_ = fStack_84c + fVar274 * fVar278;
        auVar224._24_4_ = fStack_848 + fVar293 * fVar309;
        auVar224._28_4_ = fStack_844 + auVar223._28_4_;
        auVar70._4_4_ = fStack_77c * fVar269;
        auVar70._0_4_ = local_780 * fVar321;
        auVar70._8_4_ = fStack_778 * fVar271;
        auVar70._12_4_ = fStack_774 * fVar191;
        auVar70._16_4_ = fStack_770 * fVar209;
        auVar70._20_4_ = fStack_76c * fVar229;
        auVar70._24_4_ = fStack_768 * fVar232;
        auVar70._28_4_ = fStack_604;
        auVar27 = vsubps_avx(auVar70,auVar224);
        auVar218 = auVar27._0_28_;
        auVar107 = vcmpps_avx(auVar107,_DAT_01f7b000,5);
        auVar288._8_4_ = 0x7f800000;
        auVar288._0_8_ = 0x7f8000007f800000;
        auVar288._12_4_ = 0x7f800000;
        auVar288._16_4_ = 0x7f800000;
        auVar288._20_4_ = 0x7f800000;
        auVar288._24_4_ = 0x7f800000;
        auVar288._28_4_ = 0x7f800000;
        auVar287 = vblendvps_avx(auVar288,auVar64,auVar107);
        auVar27 = vmaxps_avx(local_500,local_3a0);
        auVar71._4_4_ = auVar27._4_4_ * 1.9073486e-06;
        auVar71._0_4_ = auVar27._0_4_ * 1.9073486e-06;
        auVar71._8_4_ = auVar27._8_4_ * 1.9073486e-06;
        auVar71._12_4_ = auVar27._12_4_ * 1.9073486e-06;
        auVar71._16_4_ = auVar27._16_4_ * 1.9073486e-06;
        auVar71._20_4_ = auVar27._20_4_ * 1.9073486e-06;
        auVar71._24_4_ = auVar27._24_4_ * 1.9073486e-06;
        auVar71._28_4_ = auVar27._28_4_;
        auVar105 = vcmpps_avx(auVar105,auVar71,1);
        auVar330._8_4_ = 0xff800000;
        auVar330._0_8_ = 0xff800000ff800000;
        auVar330._12_4_ = 0xff800000;
        auVar330._16_4_ = 0xff800000;
        auVar330._20_4_ = 0xff800000;
        auVar330._24_4_ = 0xff800000;
        auVar330._28_4_ = 0xff800000;
        auVar329 = vblendvps_avx(auVar330,auVar65,auVar107);
        auVar27 = auVar107 & auVar105;
        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0x7f,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0xbf,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar27[0x1f] < '\0') {
          auVar105 = vandps_avx(auVar105,auVar107);
          auVar176 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
          auVar23 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,2);
          auVar140._8_4_ = 0xff800000;
          auVar140._0_8_ = 0xff800000ff800000;
          auVar140._12_4_ = 0xff800000;
          auVar140._16_4_ = 0xff800000;
          auVar140._20_4_ = 0xff800000;
          auVar140._24_4_ = 0xff800000;
          auVar140._28_4_ = 0xff800000;
          auVar208._8_4_ = 0x7f800000;
          auVar208._0_8_ = 0x7f8000007f800000;
          auVar208._12_4_ = 0x7f800000;
          auVar208._16_4_ = 0x7f800000;
          auVar208._20_4_ = 0x7f800000;
          auVar208._24_4_ = 0x7f800000;
          auVar208._28_4_ = 0x7f800000;
          auVar25 = vblendvps_avx(auVar208,auVar140,auVar23);
          auVar20 = vpmovsxwd_avx(auVar176);
          auVar176 = vpunpckhwd_avx(auVar176,auVar176);
          auVar372._16_16_ = auVar176;
          auVar372._0_16_ = auVar20;
          auVar287 = vblendvps_avx(auVar287,auVar25,auVar372);
          auVar25 = vblendvps_avx(auVar140,auVar208,auVar23);
          auVar329 = vblendvps_avx(auVar329,auVar25,auVar372);
          auVar164._0_8_ = auVar105._0_8_ ^ 0xffffffffffffffff;
          auVar164._8_4_ = auVar105._8_4_ ^ 0xffffffff;
          auVar164._12_4_ = auVar105._12_4_ ^ 0xffffffff;
          auVar164._16_4_ = auVar105._16_4_ ^ 0xffffffff;
          auVar164._20_4_ = auVar105._20_4_ ^ 0xffffffff;
          auVar164._24_4_ = auVar105._24_4_ ^ 0xffffffff;
          auVar164._28_4_ = auVar105._28_4_ ^ 0xffffffff;
          auVar105 = vorps_avx(auVar23,auVar164);
          auVar25 = vandps_avx(auVar107,auVar105);
        }
        auVar203 = auVar28._0_28_;
        auVar268 = ZEXT3264(local_8a0);
        auVar320 = ZEXT3264(local_9e0);
      }
      fVar315 = (ray->super_RayK<1>).dir.field_0.m128[0];
      auVar363 = ZEXT3264(CONCAT428(fVar315,CONCAT424(fVar315,CONCAT420(fVar315,CONCAT416(fVar315,
                                                  CONCAT412(fVar315,CONCAT48(fVar315,CONCAT44(
                                                  fVar315,fVar315))))))));
      fVar321 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar322 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar345 = ZEXT3264(CONCAT428(fVar322,CONCAT424(fVar322,CONCAT420(fVar322,CONCAT416(fVar322,
                                                  CONCAT412(fVar322,CONCAT48(fVar322,CONCAT44(
                                                  fVar322,fVar322))))))));
      local_5a0 = local_820;
      local_580 = vminps_avx(local_5c0,auVar287);
      _local_5e0 = vmaxps_avx(local_820,auVar329);
      auVar105 = vcmpps_avx(local_820,local_580,2);
      local_660 = vandps_avx(auVar105,auVar129);
      auVar105 = vcmpps_avx(_local_5e0,local_5c0,2);
      local_7e0 = vandps_avx(auVar105,auVar129);
      auVar105 = vorps_avx(local_660,local_7e0);
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0x7f,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0xbf,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar105[0x1f] < '\0') {
        _local_7a0 = _local_5e0;
        local_8e0._8_24_ = auVar26._8_24_;
        fVar323 = local_7e0._28_4_;
        auVar110._0_4_ =
             fVar315 * auVar186._0_4_ + fVar321 * auVar242._0_4_ + fVar322 * auVar218._0_4_;
        auVar110._4_4_ =
             fVar315 * auVar186._4_4_ + fVar321 * auVar242._4_4_ + fVar322 * auVar218._4_4_;
        auVar110._8_4_ =
             fVar315 * auVar186._8_4_ + fVar321 * auVar242._8_4_ + fVar322 * auVar218._8_4_;
        auVar110._12_4_ =
             fVar315 * auVar186._12_4_ + fVar321 * auVar242._12_4_ + fVar322 * auVar218._12_4_;
        auVar110._16_4_ =
             fVar315 * auVar186._16_4_ + fVar321 * auVar242._16_4_ + fVar322 * auVar218._16_4_;
        auVar110._20_4_ =
             fVar315 * auVar186._20_4_ + fVar321 * auVar242._20_4_ + fVar322 * auVar218._20_4_;
        auVar110._24_4_ =
             fVar315 * auVar186._24_4_ + fVar321 * auVar242._24_4_ + fVar322 * auVar218._24_4_;
        auVar110._28_4_ = fVar323 + fVar323 + auVar105._28_4_;
        auVar158._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
        auVar158._8_4_ = auVar25._8_4_ ^ 0xffffffff;
        auVar158._12_4_ = auVar25._12_4_ ^ 0xffffffff;
        auVar158._16_4_ = auVar25._16_4_ ^ 0xffffffff;
        auVar158._20_4_ = auVar25._20_4_ ^ 0xffffffff;
        auVar158._24_4_ = auVar25._24_4_ ^ 0xffffffff;
        auVar158._28_4_ = auVar25._28_4_ ^ 0xffffffff;
        auVar205._8_4_ = 0x7fffffff;
        auVar205._0_8_ = 0x7fffffff7fffffff;
        auVar205._12_4_ = 0x7fffffff;
        auVar205._16_4_ = 0x7fffffff;
        auVar205._20_4_ = 0x7fffffff;
        auVar205._24_4_ = 0x7fffffff;
        auVar205._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar110,auVar205);
        auVar225._8_4_ = 0x3e99999a;
        auVar225._0_8_ = 0x3e99999a3e99999a;
        auVar225._12_4_ = 0x3e99999a;
        auVar225._16_4_ = 0x3e99999a;
        auVar225._20_4_ = 0x3e99999a;
        auVar225._24_4_ = 0x3e99999a;
        auVar225._28_4_ = 0x3e99999a;
        auVar105 = vcmpps_avx(auVar105,auVar225,1);
        _local_6a0 = vorps_avx(auVar105,auVar158);
        auVar111._0_4_ =
             fVar315 * auVar203._0_4_ + fVar321 * auVar268._0_4_ + auVar320._0_4_ * fVar322;
        auVar111._4_4_ =
             fVar315 * auVar203._4_4_ + fVar321 * auVar268._4_4_ + auVar320._4_4_ * fVar322;
        auVar111._8_4_ =
             fVar315 * auVar203._8_4_ + fVar321 * auVar268._8_4_ + auVar320._8_4_ * fVar322;
        auVar111._12_4_ =
             fVar315 * auVar203._12_4_ + fVar321 * auVar268._12_4_ + auVar320._12_4_ * fVar322;
        auVar111._16_4_ =
             fVar315 * auVar203._16_4_ + fVar321 * auVar268._16_4_ + auVar320._16_4_ * fVar322;
        auVar111._20_4_ =
             fVar315 * auVar203._20_4_ + fVar321 * auVar268._20_4_ + auVar320._20_4_ * fVar322;
        auVar111._24_4_ =
             fVar315 * auVar203._24_4_ + fVar321 * auVar268._24_4_ + auVar320._24_4_ * fVar322;
        auVar111._28_4_ = fVar323 + auVar186._28_4_ + local_6a0._28_4_;
        auVar105 = vandps_avx(auVar111,auVar205);
        auVar105 = vcmpps_avx(auVar105,auVar225,1);
        auVar105 = vorps_avx(auVar105,auVar158);
        auVar134._8_4_ = 3;
        auVar134._0_8_ = 0x300000003;
        auVar134._12_4_ = 3;
        auVar134._16_4_ = 3;
        auVar134._20_4_ = 3;
        auVar134._24_4_ = 3;
        auVar134._28_4_ = 3;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar105 = vblendvps_avx(auVar159,auVar134,auVar105);
        local_6c0 = ZEXT432(local_b1c);
        auVar20 = vpshufd_avx(ZEXT416(local_b1c),0);
        auVar176 = vpcmpgtd_avx(auVar105._16_16_,auVar20);
        local_6e0._0_16_ = auVar20;
        auVar20 = vpcmpgtd_avx(auVar105._0_16_,auVar20);
        auVar135._16_16_ = auVar176;
        auVar135._0_16_ = auVar20;
        local_680 = vblendps_avx(ZEXT1632(auVar20),auVar135,0xf0);
        auVar105 = vandnps_avx(local_680,local_660);
        local_7c0._4_4_ = local_820._4_4_ + local_800._4_4_;
        local_7c0._0_4_ = local_820._0_4_ + local_800._0_4_;
        fStack_7b8 = local_820._8_4_ + local_800._8_4_;
        fStack_7b4 = local_820._12_4_ + local_800._12_4_;
        fStack_7b0 = local_820._16_4_ + local_800._16_4_;
        fStack_7ac = local_820._20_4_ + local_800._20_4_;
        fStack_7a8 = local_820._24_4_ + local_800._24_4_;
        fStack_7a4 = local_820._28_4_ + local_800._28_4_;
        while( true ) {
          local_3c0 = auVar105;
          local_ab0 = auVar21._0_4_;
          fStack_aac = auVar21._4_4_;
          fStack_aa8 = auVar21._8_4_;
          fStack_aa4 = auVar21._12_4_;
          local_ac0 = auVar22._0_4_;
          fStack_abc = auVar22._4_4_;
          fStack_ab8 = auVar22._8_4_;
          fStack_ab4 = auVar22._12_4_;
          local_b10 = auVar18._0_4_;
          fStack_b0c = auVar18._4_4_;
          fStack_b08 = auVar18._8_4_;
          fStack_b04 = auVar18._12_4_;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) break;
          auVar136._8_4_ = 0x7f800000;
          auVar136._0_8_ = 0x7f8000007f800000;
          auVar136._12_4_ = 0x7f800000;
          auVar136._16_4_ = 0x7f800000;
          auVar136._20_4_ = 0x7f800000;
          auVar136._24_4_ = 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar129 = vblendvps_avx(auVar136,local_820,auVar105);
          auVar25 = vshufps_avx(auVar129,auVar129,0xb1);
          auVar25 = vminps_avx(auVar129,auVar25);
          auVar23 = vshufpd_avx(auVar25,auVar25,5);
          auVar25 = vminps_avx(auVar25,auVar23);
          auVar23 = vperm2f128_avx(auVar25,auVar25,1);
          auVar25 = vminps_avx(auVar25,auVar23);
          auVar129 = vcmpps_avx(auVar129,auVar25,0);
          auVar25 = auVar105 & auVar129;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            auVar105 = vandps_avx(auVar129,auVar105);
          }
          uVar81 = vmovmskps_avx(auVar105);
          uVar87 = 0;
          if (uVar81 != 0) {
            for (; (uVar81 >> uVar87 & 1) == 0; uVar87 = uVar87 + 1) {
            }
          }
          uVar83 = (ulong)uVar87;
          *(undefined4 *)(local_3c0 + uVar83 * 4) = 0;
          aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
          local_860 = aVar9.x;
          fStack_85c = aVar9.y;
          fStack_858 = aVar9.z;
          aStack_854 = aVar9.field_3;
          auVar176 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
          fVar315 = local_1a0[uVar83];
          uVar87 = *(uint *)(local_5a0 + uVar83 * 4);
          if (auVar176._0_4_ < 0.0) {
            auVar345 = ZEXT1664(auVar345._0_16_);
            auVar363 = ZEXT1664(auVar363._0_16_);
            fVar321 = sqrtf(auVar176._0_4_);
          }
          else {
            auVar176 = vsqrtss_avx(auVar176,auVar176);
            fVar321 = auVar176._0_4_;
          }
          auVar268 = ZEXT464(uVar87);
          auVar20 = vminps_avx(auVar18,auVar22);
          auVar176 = vmaxps_avx(auVar18,auVar22);
          auVar173 = vminps_avx(auVar21,_local_990);
          auVar150 = vminps_avx(auVar20,auVar173);
          auVar20 = vmaxps_avx(auVar21,_local_990);
          auVar173 = vmaxps_avx(auVar176,auVar20);
          auVar172._8_4_ = 0x7fffffff;
          auVar172._0_8_ = 0x7fffffff7fffffff;
          auVar172._12_4_ = 0x7fffffff;
          auVar176 = vandps_avx(auVar150,auVar172);
          auVar20 = vandps_avx(auVar173,auVar172);
          auVar176 = vmaxps_avx(auVar176,auVar20);
          auVar20 = vmovshdup_avx(auVar176);
          auVar20 = vmaxss_avx(auVar20,auVar176);
          auVar176 = vshufpd_avx(auVar176,auVar176,1);
          auVar176 = vmaxss_avx(auVar176,auVar20);
          local_880 = auVar176._0_4_ * 1.9073486e-06;
          local_980._0_4_ = fVar321 * 1.9073486e-06;
          local_760._0_16_ = vshufps_avx(auVar173,auVar173,0xff);
          auVar176 = vinsertps_avx(ZEXT416(uVar87),ZEXT416((uint)fVar315),0x10);
          auVar320 = ZEXT1664(auVar176);
          lVar89 = 5;
          do {
            do {
              auVar176 = auVar320._0_16_;
              bVar91 = lVar89 == 0;
              lVar89 = lVar89 + -1;
              if (bVar91) goto LAB_008c3592;
              auVar173 = vmovshdup_avx(auVar176);
              fVar315 = auVar173._0_4_;
              fVar269 = 1.0 - fVar315;
              fVar321 = fVar269 * fVar269;
              fVar322 = fVar269 * fVar321;
              fVar323 = fVar315 * fVar315 * fVar315;
              fVar263 = fVar315 * fVar269;
              auVar20 = vshufps_avx(ZEXT416((uint)(fVar323 * 0.16666667)),
                                    ZEXT416((uint)(fVar323 * 0.16666667)),0);
              auVar150 = ZEXT416((uint)((fVar323 * 4.0 + fVar322 +
                                        fVar315 * fVar263 * 12.0 + fVar269 * fVar263 * 6.0) *
                                       0.16666667));
              auVar150 = vshufps_avx(auVar150,auVar150,0);
              auVar96 = ZEXT416((uint)((fVar322 * 4.0 + fVar323 +
                                       fVar269 * fVar263 * 12.0 + fVar315 * fVar263 * 6.0) *
                                      0.16666667));
              auVar96 = vshufps_avx(auVar96,auVar96,0);
              auVar101 = vshufps_avx(auVar176,auVar176,0);
              auVar151._0_4_ = auVar101._0_4_ * local_860 + 0.0;
              auVar151._4_4_ = auVar101._4_4_ * fStack_85c + 0.0;
              auVar151._8_4_ = auVar101._8_4_ * fStack_858 + 0.0;
              auVar151._12_4_ = auVar101._12_4_ * aStack_854.w + 0.0;
              auVar101 = vshufps_avx(ZEXT416((uint)(fVar322 * 0.16666667)),
                                     ZEXT416((uint)(fVar322 * 0.16666667)),0);
              auVar94._0_4_ =
                   auVar101._0_4_ * local_b10 +
                   auVar96._0_4_ * local_ac0 +
                   auVar20._0_4_ * (float)local_990._0_4_ + auVar150._0_4_ * local_ab0;
              auVar94._4_4_ =
                   auVar101._4_4_ * fStack_b0c +
                   auVar96._4_4_ * fStack_abc +
                   auVar20._4_4_ * (float)local_990._4_4_ + auVar150._4_4_ * fStack_aac;
              auVar94._8_4_ =
                   auVar101._8_4_ * fStack_b08 +
                   auVar96._8_4_ * fStack_ab8 +
                   auVar20._8_4_ * fStack_988 + auVar150._8_4_ * fStack_aa8;
              auVar94._12_4_ =
                   auVar101._12_4_ * fStack_b04 +
                   auVar96._12_4_ * fStack_ab4 +
                   auVar20._12_4_ * fStack_984 + auVar150._12_4_ * fStack_aa4;
              local_8a0._0_16_ = auVar94;
              auVar150 = vsubps_avx(auVar151,auVar94);
              auVar20 = vdpps_avx(auVar150,auVar150,0x7f);
              fVar322 = auVar20._0_4_;
              if (fVar322 < 0.0) {
                local_9e0._0_16_ = auVar173;
                local_900._0_4_ = fVar321;
                local_9c0._0_4_ = fVar263;
                fVar323 = sqrtf(fVar322);
                fVar321 = (float)local_900._0_4_;
                fVar263 = (float)local_9c0._0_4_;
                fVar271 = (float)local_9e0._0_4_;
              }
              else {
                auVar173 = vsqrtss_avx(auVar20,auVar20);
                fVar323 = auVar173._0_4_;
                fVar271 = fVar315;
              }
              auVar173 = ZEXT416((uint)(fVar315 * fVar315 * 0.5));
              auVar173 = vshufps_avx(auVar173,auVar173,0);
              auVar96 = ZEXT416((uint)((fVar321 + fVar263 * 4.0) * 0.5));
              auVar96 = vshufps_avx(auVar96,auVar96,0);
              auVar101 = ZEXT416((uint)((fVar271 * -fVar271 - fVar263 * 4.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar95 = ZEXT416((uint)(fVar269 * -fVar269 * 0.5));
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar283._0_4_ =
                   local_b10 * auVar95._0_4_ +
                   local_ac0 * auVar101._0_4_ +
                   (float)local_990._0_4_ * auVar173._0_4_ + local_ab0 * auVar96._0_4_;
              auVar283._4_4_ =
                   fStack_b0c * auVar95._4_4_ +
                   fStack_abc * auVar101._4_4_ +
                   (float)local_990._4_4_ * auVar173._4_4_ + fStack_aac * auVar96._4_4_;
              auVar283._8_4_ =
                   fStack_b08 * auVar95._8_4_ +
                   fStack_ab8 * auVar101._8_4_ +
                   fStack_988 * auVar173._8_4_ + fStack_aa8 * auVar96._8_4_;
              auVar283._12_4_ =
                   fStack_b04 * auVar95._12_4_ +
                   fStack_ab4 * auVar101._12_4_ +
                   fStack_984 * auVar173._12_4_ + fStack_aa4 * auVar96._12_4_;
              auVar173 = vshufps_avx(auVar176,auVar176,0x55);
              auVar96 = ZEXT416((uint)(fVar269 - (fVar271 + fVar271)));
              auVar101 = vshufps_avx(auVar96,auVar96,0);
              auVar96 = ZEXT416((uint)(fVar271 - (fVar269 + fVar269)));
              auVar95 = vshufps_avx(auVar96,auVar96,0);
              auVar100 = vshufps_avx(ZEXT416((uint)fVar269),ZEXT416((uint)fVar269),0);
              auVar96 = vdpps_avx(auVar283,auVar283,0x7f);
              auVar120._0_4_ =
                   local_b10 * auVar100._0_4_ +
                   local_ac0 * auVar95._0_4_ +
                   (float)local_990._0_4_ * auVar173._0_4_ + local_ab0 * auVar101._0_4_;
              auVar120._4_4_ =
                   fStack_b0c * auVar100._4_4_ +
                   fStack_abc * auVar95._4_4_ +
                   (float)local_990._4_4_ * auVar173._4_4_ + fStack_aac * auVar101._4_4_;
              auVar120._8_4_ =
                   fStack_b08 * auVar100._8_4_ +
                   fStack_ab8 * auVar95._8_4_ +
                   fStack_988 * auVar173._8_4_ + fStack_aa8 * auVar101._8_4_;
              auVar120._12_4_ =
                   fStack_b04 * auVar100._12_4_ +
                   fStack_ab4 * auVar95._12_4_ +
                   fStack_984 * auVar173._12_4_ + fStack_aa4 * auVar101._12_4_;
              auVar173 = vblendps_avx(auVar96,_DAT_01f45a50,0xe);
              auVar101 = vrsqrtss_avx(auVar173,auVar173);
              fVar321 = auVar101._0_4_;
              fVar315 = auVar96._0_4_;
              auVar101 = vdpps_avx(auVar283,auVar120,0x7f);
              auVar95 = vshufps_avx(auVar96,auVar96,0);
              auVar121._0_4_ = auVar120._0_4_ * auVar95._0_4_;
              auVar121._4_4_ = auVar120._4_4_ * auVar95._4_4_;
              auVar121._8_4_ = auVar120._8_4_ * auVar95._8_4_;
              auVar121._12_4_ = auVar120._12_4_ * auVar95._12_4_;
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar195._0_4_ = auVar283._0_4_ * auVar101._0_4_;
              auVar195._4_4_ = auVar283._4_4_ * auVar101._4_4_;
              auVar195._8_4_ = auVar283._8_4_ * auVar101._8_4_;
              auVar195._12_4_ = auVar283._12_4_ * auVar101._12_4_;
              auVar100 = vsubps_avx(auVar121,auVar195);
              auVar101 = vrcpss_avx(auVar173,auVar173);
              auVar173 = vmaxss_avx(ZEXT416((uint)local_880),
                                    ZEXT416((uint)(auVar320._0_4_ * (float)local_980._0_4_)));
              auVar101 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - fVar315 * auVar101._0_4_)));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              uVar83 = CONCAT44(auVar283._4_4_,auVar283._0_4_);
              auVar214._0_8_ = uVar83 ^ 0x8000000080000000;
              auVar214._8_4_ = -auVar283._8_4_;
              auVar214._12_4_ = -auVar283._12_4_;
              auVar95 = ZEXT416((uint)(fVar321 * 1.5 + fVar315 * -0.5 * fVar321 * fVar321 * fVar321)
                               );
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar174._0_4_ = auVar95._0_4_ * auVar100._0_4_ * auVar101._0_4_;
              auVar174._4_4_ = auVar95._4_4_ * auVar100._4_4_ * auVar101._4_4_;
              auVar174._8_4_ = auVar95._8_4_ * auVar100._8_4_ * auVar101._8_4_;
              auVar174._12_4_ = auVar95._12_4_ * auVar100._12_4_ * auVar101._12_4_;
              auVar240._0_4_ = auVar283._0_4_ * auVar95._0_4_;
              auVar240._4_4_ = auVar283._4_4_ * auVar95._4_4_;
              auVar240._8_4_ = auVar283._8_4_ * auVar95._8_4_;
              auVar240._12_4_ = auVar283._12_4_ * auVar95._12_4_;
              local_9e0._0_4_ = auVar173._0_4_;
              if (fVar315 < 0.0) {
                local_900._0_16_ = auVar214;
                local_9c0._0_16_ = auVar240;
                local_920._0_16_ = auVar174;
                fVar321 = sqrtf(fVar315);
                auVar174 = local_920._0_16_;
                auVar214 = local_900._0_16_;
                auVar240 = local_9c0._0_16_;
                fVar315 = (float)local_9e0._0_4_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar321 = auVar96._0_4_;
                fVar315 = auVar173._0_4_;
              }
              auVar173 = vdpps_avx(auVar150,auVar240,0x7f);
              fVar321 = (local_880 / fVar321) * (fVar323 + 1.0) + fVar315 + fVar323 * local_880;
              auVar96 = vdpps_avx(auVar214,auVar240,0x7f);
              auVar101 = vdpps_avx(auVar150,auVar174,0x7f);
              auVar75._4_4_ = fStack_85c;
              auVar75._0_4_ = local_860;
              auVar75._8_4_ = fStack_858;
              auVar75._12_4_ = aStack_854.a;
              auVar95 = vdpps_avx(auVar75,auVar240,0x7f);
              auVar100 = vdpps_avx(auVar150,auVar214,0x7f);
              fVar323 = auVar96._0_4_ + auVar101._0_4_;
              fVar263 = auVar173._0_4_;
              auVar97._0_4_ = fVar263 * fVar263;
              auVar97._4_4_ = auVar173._4_4_ * auVar173._4_4_;
              auVar97._8_4_ = auVar173._8_4_ * auVar173._8_4_;
              auVar97._12_4_ = auVar173._12_4_ * auVar173._12_4_;
              auVar101 = vsubps_avx(auVar20,auVar97);
              auVar96 = vdpps_avx(auVar150,auVar75,0x7f);
              fVar269 = auVar100._0_4_ - fVar263 * fVar323;
              fVar271 = auVar96._0_4_ - fVar263 * auVar95._0_4_;
              auVar96 = vrsqrtss_avx(auVar101,auVar101);
              fVar273 = auVar101._0_4_;
              fVar263 = auVar96._0_4_;
              fVar263 = fVar263 * 1.5 + fVar273 * -0.5 * fVar263 * fVar263 * fVar263;
              if (fVar273 < 0.0) {
                local_900._0_4_ = fVar321;
                local_9c0._0_16_ = auVar95;
                local_920._0_16_ = ZEXT416((uint)fVar323);
                local_720._0_4_ = fVar269;
                local_740._0_4_ = fVar271;
                local_8c0._0_4_ = fVar263;
                fVar273 = sqrtf(fVar273);
                fVar263 = (float)local_8c0._0_4_;
                fVar269 = (float)local_720._0_4_;
                fVar271 = (float)local_740._0_4_;
                auVar95 = local_9c0._0_16_;
                fVar321 = (float)local_900._0_4_;
                fVar315 = (float)local_9e0._0_4_;
                auVar96 = local_920._0_16_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar101,auVar101);
                fVar273 = auVar96._0_4_;
                auVar96 = ZEXT416((uint)fVar323);
              }
              auVar363 = ZEXT1664(auVar173);
              auVar345 = ZEXT464((uint)fVar321);
              auVar268 = ZEXT1664(auVar20);
              auVar100 = vpermilps_avx(local_8a0._0_16_,0xff);
              auVar126 = vshufps_avx(auVar283,auVar283,0xff);
              fVar323 = fVar269 * fVar263 - auVar126._0_4_;
              auVar196._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
              auVar196._8_4_ = auVar95._8_4_ ^ 0x80000000;
              auVar196._12_4_ = auVar95._12_4_ ^ 0x80000000;
              auVar215._0_4_ = -fVar323;
              auVar215._4_4_ = 0x80000000;
              auVar215._8_4_ = 0x80000000;
              auVar215._12_4_ = 0x80000000;
              auVar101 = vinsertps_avx(auVar215,ZEXT416((uint)(fVar271 * fVar263)),0x1c);
              auVar95 = vmovsldup_avx(ZEXT416((uint)(auVar96._0_4_ * fVar271 * fVar263 -
                                                    auVar95._0_4_ * fVar323)));
              auVar101 = vdivps_avx(auVar101,auVar95);
              auVar96 = vinsertps_avx(auVar96,auVar196,0x10);
              auVar96 = vdivps_avx(auVar96,auVar95);
              auVar95 = vmovsldup_avx(auVar173);
              auVar98 = ZEXT416((uint)(fVar273 - auVar100._0_4_));
              auVar100 = vmovsldup_avx(auVar98);
              auVar152._0_4_ = auVar95._0_4_ * auVar101._0_4_ + auVar100._0_4_ * auVar96._0_4_;
              auVar152._4_4_ = auVar95._4_4_ * auVar101._4_4_ + auVar100._4_4_ * auVar96._4_4_;
              auVar152._8_4_ = auVar95._8_4_ * auVar101._8_4_ + auVar100._8_4_ * auVar96._8_4_;
              auVar152._12_4_ = auVar95._12_4_ * auVar101._12_4_ + auVar100._12_4_ * auVar96._12_4_;
              auVar96 = vsubps_avx(auVar176,auVar152);
              auVar320 = ZEXT1664(auVar96);
              auVar153._8_4_ = 0x7fffffff;
              auVar153._0_8_ = 0x7fffffff7fffffff;
              auVar153._12_4_ = 0x7fffffff;
              auVar176 = vandps_avx(auVar173,auVar153);
            } while (fVar321 <= auVar176._0_4_);
            auVar175._8_4_ = 0x7fffffff;
            auVar175._0_8_ = 0x7fffffff7fffffff;
            auVar175._12_4_ = 0x7fffffff;
            auVar176 = vandps_avx(auVar98,auVar175);
          } while ((float)local_760._0_4_ * 1.9073486e-06 + fVar315 + fVar321 <= auVar176._0_4_);
          fVar315 = auVar96._0_4_ + (float)local_840._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar315) &&
             (fVar323 = (ray->super_RayK<1>).tfar, fVar315 <= fVar323)) {
            auVar176 = vmovshdup_avx(auVar96);
            fVar263 = auVar176._0_4_;
            if ((0.0 <= fVar263) && (fVar263 <= 1.0)) {
              auVar176 = vrsqrtss_avx(auVar20,auVar20);
              fVar269 = auVar176._0_4_;
              pGVar12 = (context->scene->geometries).items[uVar86].ptr;
              if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar176 = ZEXT416((uint)(fVar269 * 1.5 +
                                         fVar322 * -0.5 * fVar269 * fVar269 * fVar269));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                local_a60 = auVar150._0_4_;
                fStack_a5c = auVar150._4_4_;
                fStack_a58 = auVar150._8_4_;
                fStack_a54 = auVar150._12_4_;
                auVar177._0_4_ = auVar176._0_4_ * local_a60;
                auVar177._4_4_ = auVar176._4_4_ * fStack_a5c;
                auVar177._8_4_ = auVar176._8_4_ * fStack_a58;
                auVar177._12_4_ = auVar176._12_4_ * fStack_a54;
                auVar122._0_4_ = auVar283._0_4_ + auVar126._0_4_ * auVar177._0_4_;
                auVar122._4_4_ = auVar283._4_4_ + auVar126._4_4_ * auVar177._4_4_;
                auVar122._8_4_ = auVar283._8_4_ + auVar126._8_4_ * auVar177._8_4_;
                auVar122._12_4_ = auVar283._12_4_ + auVar126._12_4_ * auVar177._12_4_;
                auVar176 = vshufps_avx(auVar177,auVar177,0xc9);
                auVar150 = vshufps_avx(auVar283,auVar283,0xc9);
                auVar178._0_4_ = auVar150._0_4_ * auVar177._0_4_;
                auVar178._4_4_ = auVar150._4_4_ * auVar177._4_4_;
                auVar178._8_4_ = auVar150._8_4_ * auVar177._8_4_;
                auVar178._12_4_ = auVar150._12_4_ * auVar177._12_4_;
                auVar197._0_4_ = auVar283._0_4_ * auVar176._0_4_;
                auVar197._4_4_ = auVar283._4_4_ * auVar176._4_4_;
                auVar197._8_4_ = auVar283._8_4_ * auVar176._8_4_;
                auVar197._12_4_ = auVar283._12_4_ * auVar176._12_4_;
                auVar101 = vsubps_avx(auVar197,auVar178);
                auVar176 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar150 = vshufps_avx(auVar122,auVar122,0xc9);
                auVar198._0_4_ = auVar150._0_4_ * auVar176._0_4_;
                auVar198._4_4_ = auVar150._4_4_ * auVar176._4_4_;
                auVar198._8_4_ = auVar150._8_4_ * auVar176._8_4_;
                auVar198._12_4_ = auVar150._12_4_ * auVar176._12_4_;
                auVar176 = vshufps_avx(auVar101,auVar101,0xd2);
                auVar123._0_4_ = auVar122._0_4_ * auVar176._0_4_;
                auVar123._4_4_ = auVar122._4_4_ * auVar176._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar176._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar176._12_4_;
                auVar150 = vsubps_avx(auVar198,auVar123);
                auVar176 = vshufps_avx(auVar150,auVar150,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar315;
                  uVar8 = vmovlps_avx(auVar176);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                  (ray->Ng).field_0.field_0.z = auVar150._0_4_;
                  ray->u = fVar263;
                  ray->v = 0.0;
                  ray->primID = local_8e0._0_4_;
                  ray->geomID = uVar86;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_950 = vmovlps_avx(auVar176);
                  local_948 = auVar150._0_4_;
                  local_944 = fVar263;
                  local_940 = 0;
                  local_93c = local_8e0._0_4_;
                  local_938 = uVar86;
                  local_934 = context->user->instID[0];
                  local_930 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar315;
                  local_700._0_4_ = 0xffffffff;
                  local_a18.valid = (int *)local_700;
                  local_a18.geometryUserPtr = pGVar12->userPtr;
                  local_a18.context = context->user;
                  local_a18.hit = (RTCHitN *)&local_950;
                  local_a18.N = 1;
                  local_a18.ray = (RTCRayN *)ray;
                  if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_008c36b1:
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      auVar320 = ZEXT1664(auVar320._0_16_);
                      auVar345 = ZEXT1664(auVar345._0_16_);
                      auVar363 = ZEXT1664(auVar363._0_16_);
                      (*p_Var17)(&local_a18);
                      if (*local_a18.valid == 0) goto LAB_008c3751;
                    }
                    (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).components[0] =
                         *(float *)local_a18.hit;
                    (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_a18.hit + 4);
                    (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_a18.hit + 8);
                    *(float *)((long)local_a18.ray + 0x3c) = *(float *)(local_a18.hit + 0xc);
                    *(float *)((long)local_a18.ray + 0x40) = *(float *)(local_a18.hit + 0x10);
                    *(float *)((long)local_a18.ray + 0x44) = *(float *)(local_a18.hit + 0x14);
                    *(float *)((long)local_a18.ray + 0x48) = *(float *)(local_a18.hit + 0x18);
                    *(float *)((long)local_a18.ray + 0x4c) = *(float *)(local_a18.hit + 0x1c);
                    *(float *)((long)local_a18.ray + 0x50) = *(float *)(local_a18.hit + 0x20);
                  }
                  else {
                    auVar268 = ZEXT1664(auVar20);
                    auVar320 = ZEXT1664(auVar96);
                    auVar345 = ZEXT464((uint)fVar321);
                    auVar363 = ZEXT1664(auVar173);
                    (*pGVar12->intersectionFilterN)(&local_a18);
                    if (*local_a18.valid != 0) goto LAB_008c36b1;
LAB_008c3751:
                    (ray->super_RayK<1>).tfar = fVar323;
                  }
                }
              }
            }
          }
LAB_008c3592:
          fVar315 = (ray->super_RayK<1>).tfar;
          auVar112._4_4_ = fVar315;
          auVar112._0_4_ = fVar315;
          auVar112._8_4_ = fVar315;
          auVar112._12_4_ = fVar315;
          auVar112._16_4_ = fVar315;
          auVar112._20_4_ = fVar315;
          auVar112._24_4_ = fVar315;
          auVar112._28_4_ = fVar315;
          auVar105 = vcmpps_avx(_local_7c0,auVar112,2);
          auVar105 = vandps_avx(auVar105,local_3c0);
        }
        auVar137._0_4_ = local_800._0_4_ + (float)local_7a0._0_4_;
        auVar137._4_4_ = local_800._4_4_ + (float)local_7a0._4_4_;
        auVar137._8_4_ = local_800._8_4_ + fStack_798;
        auVar137._12_4_ = local_800._12_4_ + fStack_794;
        auVar137._16_4_ = local_800._16_4_ + fStack_790;
        auVar137._20_4_ = local_800._20_4_ + fStack_78c;
        auVar137._24_4_ = local_800._24_4_ + fStack_788;
        auVar137._28_4_ = local_800._28_4_ + fStack_784;
        auVar105 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        fVar315 = (ray->super_RayK<1>).tfar;
        auVar160._4_4_ = fVar315;
        auVar160._0_4_ = fVar315;
        auVar160._8_4_ = fVar315;
        auVar160._12_4_ = fVar315;
        auVar160._16_4_ = fVar315;
        auVar160._20_4_ = fVar315;
        auVar160._24_4_ = fVar315;
        auVar160._28_4_ = fVar315;
        auVar129 = vcmpps_avx(auVar137,auVar160,2);
        _local_7c0 = vandps_avx(auVar129,local_7e0);
        auVar138._8_4_ = 3;
        auVar138._0_8_ = 0x300000003;
        auVar138._12_4_ = 3;
        auVar138._16_4_ = 3;
        auVar138._20_4_ = 3;
        auVar138._24_4_ = 3;
        auVar138._28_4_ = 3;
        auVar161._8_4_ = 2;
        auVar161._0_8_ = 0x200000002;
        auVar161._12_4_ = 2;
        auVar161._16_4_ = 2;
        auVar161._20_4_ = 2;
        auVar161._24_4_ = 2;
        auVar161._28_4_ = 2;
        auVar129 = vblendvps_avx(auVar161,auVar138,_local_6a0);
        auVar176 = vpcmpgtd_avx(auVar129._16_16_,local_6e0._0_16_);
        auVar20 = vpshufd_avx(local_6c0._0_16_,0);
        auVar20 = vpcmpgtd_avx(auVar129._0_16_,auVar20);
        auVar162._16_16_ = auVar176;
        auVar162._0_16_ = auVar105._0_16_;
        local_7e0 = vblendps_avx(ZEXT1632(auVar20),auVar162,0xf0);
        auVar129 = vandnps_avx(local_7e0,_local_7c0);
        local_820 = _local_5e0;
        local_7a0._4_4_ = local_800._4_4_ + (float)local_5e0._4_4_;
        local_7a0._0_4_ = local_800._0_4_ + (float)local_5e0._0_4_;
        fStack_798 = local_800._8_4_ + fStack_5d8;
        fStack_794 = local_800._12_4_ + fStack_5d4;
        fStack_790 = local_800._16_4_ + fStack_5d0;
        fStack_78c = local_800._20_4_ + fStack_5cc;
        fStack_788 = local_800._24_4_ + fStack_5c8;
        fStack_784 = local_800._28_4_ + fStack_5c4;
        while( true ) {
          local_700 = auVar129;
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar129 >> 0x7f,0) == '\0') &&
                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0xbf,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar129[0x1f]) break;
          auVar113._8_4_ = 0x7f800000;
          auVar113._0_8_ = 0x7f8000007f800000;
          auVar113._12_4_ = 0x7f800000;
          auVar113._16_4_ = 0x7f800000;
          auVar113._20_4_ = 0x7f800000;
          auVar113._24_4_ = 0x7f800000;
          auVar113._28_4_ = 0x7f800000;
          auVar105 = vblendvps_avx(auVar113,local_820,auVar129);
          auVar25 = vshufps_avx(auVar105,auVar105,0xb1);
          auVar25 = vminps_avx(auVar105,auVar25);
          auVar23 = vshufpd_avx(auVar25,auVar25,5);
          auVar25 = vminps_avx(auVar25,auVar23);
          auVar23 = vperm2f128_avx(auVar25,auVar25,1);
          auVar25 = vminps_avx(auVar25,auVar23);
          auVar105 = vcmpps_avx(auVar105,auVar25,0);
          auVar25 = auVar129 & auVar105;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            auVar129 = vandps_avx(auVar105,auVar129);
          }
          uVar81 = vmovmskps_avx(auVar129);
          uVar87 = 0;
          if (uVar81 != 0) {
            for (; (uVar81 >> uVar87 & 1) == 0; uVar87 = uVar87 + 1) {
            }
          }
          uVar83 = (ulong)uVar87;
          *(undefined4 *)(local_700 + uVar83 * 4) = 0;
          aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
          local_860 = aVar9.x;
          fStack_85c = aVar9.y;
          fStack_858 = aVar9.z;
          aStack_854 = aVar9.field_3;
          auVar176 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
          fVar315 = local_1c0[uVar83];
          uVar87 = *(uint *)(local_5c0 + uVar83 * 4);
          if (auVar176._0_4_ < 0.0) {
            auVar320 = ZEXT1664(auVar320._0_16_);
            auVar345 = ZEXT1664(auVar345._0_16_);
            auVar363 = ZEXT1664(auVar363._0_16_);
            fVar321 = sqrtf(auVar176._0_4_);
          }
          else {
            auVar176 = vsqrtss_avx(auVar176,auVar176);
            fVar321 = auVar176._0_4_;
          }
          auVar268 = ZEXT464(uVar87);
          auVar20 = vminps_avx(auVar18,auVar22);
          auVar176 = vmaxps_avx(auVar18,auVar22);
          auVar173 = vminps_avx(auVar21,_local_990);
          auVar150 = vminps_avx(auVar20,auVar173);
          auVar20 = vmaxps_avx(auVar21,_local_990);
          auVar173 = vmaxps_avx(auVar176,auVar20);
          auVar179._8_4_ = 0x7fffffff;
          auVar179._0_8_ = 0x7fffffff7fffffff;
          auVar179._12_4_ = 0x7fffffff;
          auVar176 = vandps_avx(auVar150,auVar179);
          auVar20 = vandps_avx(auVar173,auVar179);
          auVar176 = vmaxps_avx(auVar176,auVar20);
          auVar20 = vmovshdup_avx(auVar176);
          auVar20 = vmaxss_avx(auVar20,auVar176);
          auVar176 = vshufpd_avx(auVar176,auVar176,1);
          auVar176 = vmaxss_avx(auVar176,auVar20);
          local_880 = auVar176._0_4_ * 1.9073486e-06;
          local_900._0_4_ = fVar321 * 1.9073486e-06;
          local_760._0_16_ = vshufps_avx(auVar173,auVar173,0xff);
          auVar176 = vinsertps_avx(ZEXT416(uVar87),ZEXT416((uint)fVar315),0x10);
          auVar228 = ZEXT1664(auVar176);
          lVar89 = 5;
          do {
            do {
              auVar176 = auVar228._0_16_;
              bVar91 = lVar89 == 0;
              lVar89 = lVar89 + -1;
              if (bVar91) goto LAB_008c403f;
              auVar173 = vmovshdup_avx(auVar176);
              fVar269 = auVar173._0_4_;
              fVar263 = 1.0 - fVar269;
              fVar315 = fVar263 * fVar263 * fVar263;
              fVar321 = fVar269 * fVar269;
              fVar322 = fVar269 * fVar321;
              fVar323 = fVar269 * fVar263;
              auVar20 = vshufps_avx(ZEXT416((uint)(fVar322 * 0.16666667)),
                                    ZEXT416((uint)(fVar322 * 0.16666667)),0);
              auVar150 = ZEXT416((uint)((fVar322 * 4.0 + fVar315 +
                                        fVar269 * fVar323 * 12.0 + fVar263 * fVar323 * 6.0) *
                                       0.16666667));
              auVar150 = vshufps_avx(auVar150,auVar150,0);
              auVar96 = ZEXT416((uint)((fVar315 * 4.0 + fVar322 +
                                       fVar263 * fVar323 * 12.0 + fVar269 * fVar323 * 6.0) *
                                      0.16666667));
              auVar96 = vshufps_avx(auVar96,auVar96,0);
              auVar101 = vshufps_avx(auVar176,auVar176,0);
              auVar154._0_4_ = auVar101._0_4_ * local_860 + 0.0;
              auVar154._4_4_ = auVar101._4_4_ * fStack_85c + 0.0;
              auVar154._8_4_ = auVar101._8_4_ * fStack_858 + 0.0;
              auVar154._12_4_ = auVar101._12_4_ * aStack_854.w + 0.0;
              auVar101 = vshufps_avx(ZEXT416((uint)(fVar315 * 0.16666667)),
                                     ZEXT416((uint)(fVar315 * 0.16666667)),0);
              auVar99._0_4_ =
                   auVar101._0_4_ * local_b10 +
                   auVar96._0_4_ * local_ac0 +
                   auVar20._0_4_ * (float)local_990._0_4_ + auVar150._0_4_ * local_ab0;
              auVar99._4_4_ =
                   auVar101._4_4_ * fStack_b0c +
                   auVar96._4_4_ * fStack_abc +
                   auVar20._4_4_ * (float)local_990._4_4_ + auVar150._4_4_ * fStack_aac;
              auVar99._8_4_ =
                   auVar101._8_4_ * fStack_b08 +
                   auVar96._8_4_ * fStack_ab8 +
                   auVar20._8_4_ * fStack_988 + auVar150._8_4_ * fStack_aa8;
              auVar99._12_4_ =
                   auVar101._12_4_ * fStack_b04 +
                   auVar96._12_4_ * fStack_ab4 +
                   auVar20._12_4_ * fStack_984 + auVar150._12_4_ * fStack_aa4;
              local_8a0._0_16_ = auVar99;
              auVar150 = vsubps_avx(auVar154,auVar99);
              auVar20 = vdpps_avx(auVar150,auVar150,0x7f);
              fVar315 = auVar20._0_4_;
              if (fVar315 < 0.0) {
                local_9e0._0_16_ = auVar173;
                local_980._0_4_ = fVar321;
                local_9c0._0_4_ = fVar323;
                fVar322 = sqrtf(fVar315);
                fVar321 = (float)local_980._0_4_;
                fVar323 = (float)local_9c0._0_4_;
                auVar173 = local_9e0._0_16_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar20,auVar20);
                fVar322 = auVar96._0_4_;
              }
              auVar345 = ZEXT464((uint)fVar263);
              auVar363 = ZEXT1664(auVar173);
              fVar269 = auVar173._0_4_;
              auVar96 = vshufps_avx(ZEXT416((uint)(fVar321 * 0.5)),ZEXT416((uint)(fVar321 * 0.5)),0)
              ;
              auVar101 = ZEXT416((uint)((fVar263 * fVar263 + fVar323 * 4.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar95 = ZEXT416((uint)((fVar269 * -fVar269 - fVar323 * 4.0) * 0.5));
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar100 = ZEXT416((uint)(fVar263 * -fVar263 * 0.5));
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar284._0_4_ =
                   local_b10 * auVar100._0_4_ +
                   local_ac0 * auVar95._0_4_ +
                   (float)local_990._0_4_ * auVar96._0_4_ + local_ab0 * auVar101._0_4_;
              auVar284._4_4_ =
                   fStack_b0c * auVar100._4_4_ +
                   fStack_abc * auVar95._4_4_ +
                   (float)local_990._4_4_ * auVar96._4_4_ + fStack_aac * auVar101._4_4_;
              auVar284._8_4_ =
                   fStack_b08 * auVar100._8_4_ +
                   fStack_ab8 * auVar95._8_4_ +
                   fStack_988 * auVar96._8_4_ + fStack_aa8 * auVar101._8_4_;
              auVar284._12_4_ =
                   fStack_b04 * auVar100._12_4_ +
                   fStack_ab4 * auVar95._12_4_ +
                   fStack_984 * auVar96._12_4_ + fStack_aa4 * auVar101._12_4_;
              auVar96 = vshufps_avx(auVar176,auVar176,0x55);
              auVar101 = ZEXT416((uint)(fVar263 - (fVar269 + fVar269)));
              auVar95 = vshufps_avx(auVar101,auVar101,0);
              auVar101 = ZEXT416((uint)(fVar269 - (fVar263 + fVar263)));
              auVar100 = vshufps_avx(auVar101,auVar101,0);
              auVar98 = ZEXT416((uint)fVar263);
              auVar126 = vshufps_avx(auVar98,auVar98,0);
              auVar101 = vdpps_avx(auVar284,auVar284,0x7f);
              auVar124._0_4_ =
                   local_b10 * auVar126._0_4_ +
                   local_ac0 * auVar100._0_4_ +
                   (float)local_990._0_4_ * auVar96._0_4_ + local_ab0 * auVar95._0_4_;
              auVar124._4_4_ =
                   fStack_b0c * auVar126._4_4_ +
                   fStack_abc * auVar100._4_4_ +
                   (float)local_990._4_4_ * auVar96._4_4_ + fStack_aac * auVar95._4_4_;
              auVar124._8_4_ =
                   fStack_b08 * auVar126._8_4_ +
                   fStack_ab8 * auVar100._8_4_ +
                   fStack_988 * auVar96._8_4_ + fStack_aa8 * auVar95._8_4_;
              auVar124._12_4_ =
                   fStack_b04 * auVar126._12_4_ +
                   fStack_ab4 * auVar100._12_4_ +
                   fStack_984 * auVar96._12_4_ + fStack_aa4 * auVar95._12_4_;
              auVar96 = vblendps_avx(auVar101,_DAT_01f45a50,0xe);
              auVar95 = vrsqrtss_avx(auVar96,auVar96);
              fVar323 = auVar95._0_4_;
              fVar321 = auVar101._0_4_;
              auVar95 = vdpps_avx(auVar284,auVar124,0x7f);
              auVar100 = vshufps_avx(auVar101,auVar101,0);
              auVar125._0_4_ = auVar124._0_4_ * auVar100._0_4_;
              auVar125._4_4_ = auVar124._4_4_ * auVar100._4_4_;
              auVar125._8_4_ = auVar124._8_4_ * auVar100._8_4_;
              auVar125._12_4_ = auVar124._12_4_ * auVar100._12_4_;
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              auVar199._0_4_ = auVar284._0_4_ * auVar95._0_4_;
              auVar199._4_4_ = auVar284._4_4_ * auVar95._4_4_;
              auVar199._8_4_ = auVar284._8_4_ * auVar95._8_4_;
              auVar199._12_4_ = auVar284._12_4_ * auVar95._12_4_;
              auVar126 = vsubps_avx(auVar125,auVar199);
              auVar95 = vrcpss_avx(auVar96,auVar96);
              auVar96 = vmaxss_avx(ZEXT416((uint)local_880),
                                   ZEXT416((uint)(auVar228._0_4_ * (float)local_900._0_4_)));
              auVar95 = ZEXT416((uint)(auVar95._0_4_ * (2.0 - fVar321 * auVar95._0_4_)));
              auVar95 = vshufps_avx(auVar95,auVar95,0);
              uVar83 = CONCAT44(auVar284._4_4_,auVar284._0_4_);
              auVar216._0_8_ = uVar83 ^ 0x8000000080000000;
              auVar216._8_4_ = -auVar284._8_4_;
              auVar216._12_4_ = -auVar284._12_4_;
              auVar100 = ZEXT416((uint)(fVar323 * 1.5 + fVar321 * -0.5 * fVar323 * fVar323 * fVar323
                                       ));
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar180._0_4_ = auVar100._0_4_ * auVar126._0_4_ * auVar95._0_4_;
              auVar180._4_4_ = auVar100._4_4_ * auVar126._4_4_ * auVar95._4_4_;
              auVar180._8_4_ = auVar100._8_4_ * auVar126._8_4_ * auVar95._8_4_;
              auVar180._12_4_ = auVar100._12_4_ * auVar126._12_4_ * auVar95._12_4_;
              auVar241._0_4_ = auVar284._0_4_ * auVar100._0_4_;
              auVar241._4_4_ = auVar284._4_4_ * auVar100._4_4_;
              auVar241._8_4_ = auVar284._8_4_ * auVar100._8_4_;
              auVar241._12_4_ = auVar284._12_4_ * auVar100._12_4_;
              local_9e0._0_4_ = auVar96._0_4_;
              if (fVar321 < 0.0) {
                local_980._0_4_ = fVar322;
                local_9c0._0_16_ = auVar241;
                local_920._0_16_ = auVar180;
                auVar345 = ZEXT1664(auVar98);
                auVar363 = ZEXT1664(auVar173);
                fVar323 = sqrtf(fVar321);
                auVar180 = local_920._0_16_;
                auVar241 = local_9c0._0_16_;
                fVar322 = (float)local_980._0_4_;
                fVar321 = (float)local_9e0._0_4_;
              }
              else {
                auVar173 = vsqrtss_avx(auVar101,auVar101);
                fVar323 = auVar173._0_4_;
                fVar321 = auVar96._0_4_;
              }
              auVar173 = vdpps_avx(auVar150,auVar241,0x7f);
              local_980._0_4_ =
                   (local_880 / fVar323) * (fVar322 + 1.0) + fVar321 + fVar322 * local_880;
              auVar96 = vdpps_avx(auVar216,auVar241,0x7f);
              auVar101 = vdpps_avx(auVar150,auVar180,0x7f);
              auVar76._4_4_ = fStack_85c;
              auVar76._0_4_ = local_860;
              auVar76._8_4_ = fStack_858;
              auVar76._12_4_ = aStack_854.a;
              auVar95 = vdpps_avx(auVar76,auVar241,0x7f);
              auVar100 = vdpps_avx(auVar150,auVar216,0x7f);
              fVar322 = auVar96._0_4_ + auVar101._0_4_;
              fVar323 = auVar173._0_4_;
              auVar102._0_4_ = fVar323 * fVar323;
              auVar102._4_4_ = auVar173._4_4_ * auVar173._4_4_;
              auVar102._8_4_ = auVar173._8_4_ * auVar173._8_4_;
              auVar102._12_4_ = auVar173._12_4_ * auVar173._12_4_;
              auVar101 = vsubps_avx(auVar20,auVar102);
              auVar126 = ZEXT416((uint)fVar322);
              auVar96 = vdpps_avx(auVar150,auVar76,0x7f);
              fVar263 = auVar100._0_4_ - fVar323 * fVar322;
              fVar269 = auVar96._0_4_ - fVar323 * auVar95._0_4_;
              auVar96 = vrsqrtss_avx(auVar101,auVar101);
              fVar271 = auVar101._0_4_;
              fVar323 = auVar96._0_4_;
              fVar323 = fVar323 * 1.5 + fVar271 * -0.5 * fVar323 * fVar323 * fVar323;
              if (fVar271 < 0.0) {
                local_9c0._0_16_ = auVar173;
                local_920._0_16_ = auVar95;
                local_720._0_4_ = fVar263;
                local_740._0_4_ = fVar269;
                local_8c0._0_4_ = fVar323;
                auVar345 = ZEXT1664(auVar345._0_16_);
                auVar363 = ZEXT1664(auVar363._0_16_);
                fVar271 = sqrtf(fVar271);
                fVar323 = (float)local_8c0._0_4_;
                fVar263 = (float)local_720._0_4_;
                fVar269 = (float)local_740._0_4_;
                auVar95 = local_920._0_16_;
                auVar173 = local_9c0._0_16_;
                fVar321 = (float)local_9e0._0_4_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar101,auVar101);
                fVar271 = auVar96._0_4_;
              }
              auVar268 = ZEXT1664(auVar20);
              auVar100 = vpermilps_avx(local_8a0._0_16_,0xff);
              auVar98 = vshufps_avx(auVar284,auVar284,0xff);
              fVar263 = fVar263 * fVar323 - auVar98._0_4_;
              auVar200._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
              auVar200._8_4_ = auVar95._8_4_ ^ 0x80000000;
              auVar200._12_4_ = auVar95._12_4_ ^ 0x80000000;
              auVar217._0_4_ = -fVar263;
              auVar217._4_4_ = 0x80000000;
              auVar217._8_4_ = 0x80000000;
              auVar217._12_4_ = 0x80000000;
              auVar320 = ZEXT1664(auVar126);
              auVar96 = vinsertps_avx(auVar217,ZEXT416((uint)(fVar269 * fVar323)),0x1c);
              auVar95 = vmovsldup_avx(ZEXT416((uint)(fVar322 * fVar269 * fVar323 -
                                                    auVar95._0_4_ * fVar263)));
              auVar96 = vdivps_avx(auVar96,auVar95);
              auVar101 = vinsertps_avx(auVar126,auVar200,0x10);
              auVar101 = vdivps_avx(auVar101,auVar95);
              auVar95 = vmovsldup_avx(auVar173);
              auVar103 = ZEXT416((uint)(fVar271 - auVar100._0_4_));
              auVar100 = vmovsldup_avx(auVar103);
              auVar155._0_4_ = auVar95._0_4_ * auVar96._0_4_ + auVar100._0_4_ * auVar101._0_4_;
              auVar155._4_4_ = auVar95._4_4_ * auVar96._4_4_ + auVar100._4_4_ * auVar101._4_4_;
              auVar155._8_4_ = auVar95._8_4_ * auVar96._8_4_ + auVar100._8_4_ * auVar101._8_4_;
              auVar155._12_4_ = auVar95._12_4_ * auVar96._12_4_ + auVar100._12_4_ * auVar101._12_4_;
              auVar96 = vsubps_avx(auVar176,auVar155);
              auVar228 = ZEXT1664(auVar96);
              auVar156._8_4_ = 0x7fffffff;
              auVar156._0_8_ = 0x7fffffff7fffffff;
              auVar156._12_4_ = 0x7fffffff;
              auVar176 = vandps_avx(auVar173,auVar156);
            } while ((float)local_980._0_4_ <= auVar176._0_4_);
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar176 = vandps_avx(auVar103,auVar181);
          } while ((float)local_760._0_4_ * 1.9073486e-06 + fVar321 + (float)local_980._0_4_ <=
                   auVar176._0_4_);
          fVar321 = auVar96._0_4_ + (float)local_840._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar321) &&
             (fVar322 = (ray->super_RayK<1>).tfar, fVar321 <= fVar322)) {
            auVar176 = vmovshdup_avx(auVar96);
            fVar323 = auVar176._0_4_;
            if ((0.0 <= fVar323) && (fVar323 <= 1.0)) {
              auVar176 = vrsqrtss_avx(auVar20,auVar20);
              fVar263 = auVar176._0_4_;
              pGVar12 = (context->scene->geometries).items[uVar86].ptr;
              if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar176 = ZEXT416((uint)(fVar263 * 1.5 +
                                         fVar315 * -0.5 * fVar263 * fVar263 * fVar263));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                local_a60 = auVar150._0_4_;
                fStack_a5c = auVar150._4_4_;
                fStack_a58 = auVar150._8_4_;
                fStack_a54 = auVar150._12_4_;
                auVar182._0_4_ = auVar176._0_4_ * local_a60;
                auVar182._4_4_ = auVar176._4_4_ * fStack_a5c;
                auVar182._8_4_ = auVar176._8_4_ * fStack_a58;
                auVar182._12_4_ = auVar176._12_4_ * fStack_a54;
                auVar127._0_4_ = auVar284._0_4_ + auVar98._0_4_ * auVar182._0_4_;
                auVar127._4_4_ = auVar284._4_4_ + auVar98._4_4_ * auVar182._4_4_;
                auVar127._8_4_ = auVar284._8_4_ + auVar98._8_4_ * auVar182._8_4_;
                auVar127._12_4_ = auVar284._12_4_ + auVar98._12_4_ * auVar182._12_4_;
                auVar176 = vshufps_avx(auVar182,auVar182,0xc9);
                auVar173 = vshufps_avx(auVar284,auVar284,0xc9);
                auVar183._0_4_ = auVar173._0_4_ * auVar182._0_4_;
                auVar183._4_4_ = auVar173._4_4_ * auVar182._4_4_;
                auVar183._8_4_ = auVar173._8_4_ * auVar182._8_4_;
                auVar183._12_4_ = auVar173._12_4_ * auVar182._12_4_;
                auVar201._0_4_ = auVar284._0_4_ * auVar176._0_4_;
                auVar201._4_4_ = auVar284._4_4_ * auVar176._4_4_;
                auVar201._8_4_ = auVar284._8_4_ * auVar176._8_4_;
                auVar201._12_4_ = auVar284._12_4_ * auVar176._12_4_;
                auVar150 = vsubps_avx(auVar201,auVar183);
                auVar176 = vshufps_avx(auVar150,auVar150,0xc9);
                auVar173 = vshufps_avx(auVar127,auVar127,0xc9);
                auVar202._0_4_ = auVar173._0_4_ * auVar176._0_4_;
                auVar202._4_4_ = auVar173._4_4_ * auVar176._4_4_;
                auVar202._8_4_ = auVar173._8_4_ * auVar176._8_4_;
                auVar202._12_4_ = auVar173._12_4_ * auVar176._12_4_;
                auVar176 = vshufps_avx(auVar150,auVar150,0xd2);
                auVar128._0_4_ = auVar127._0_4_ * auVar176._0_4_;
                auVar128._4_4_ = auVar127._4_4_ * auVar176._4_4_;
                auVar128._8_4_ = auVar127._8_4_ * auVar176._8_4_;
                auVar128._12_4_ = auVar127._12_4_ * auVar176._12_4_;
                auVar173 = vsubps_avx(auVar202,auVar128);
                auVar176 = vshufps_avx(auVar173,auVar173,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar321;
                  uVar8 = vmovlps_avx(auVar176);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                  (ray->Ng).field_0.field_0.z = auVar173._0_4_;
                  ray->u = fVar323;
                  ray->v = 0.0;
                  ray->primID = local_8e0._0_4_;
                  ray->geomID = uVar86;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_950 = vmovlps_avx(auVar176);
                  local_948 = auVar173._0_4_;
                  local_944 = fVar323;
                  local_940 = 0;
                  local_93c = local_8e0._0_4_;
                  local_938 = uVar86;
                  local_934 = context->user->instID[0];
                  local_930 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar321;
                  local_9e4 = -1;
                  local_a18.valid = &local_9e4;
                  local_a18.geometryUserPtr = pGVar12->userPtr;
                  local_a18.context = context->user;
                  local_a18.hit = (RTCHitN *)&local_950;
                  local_a18.N = 1;
                  local_a18.ray = (RTCRayN *)ray;
                  if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_008c415b:
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      auVar320 = ZEXT1664(auVar320._0_16_);
                      auVar345 = ZEXT1664(auVar345._0_16_);
                      auVar363 = ZEXT1664(auVar363._0_16_);
                      (*p_Var17)(&local_a18);
                      if (*local_a18.valid == 0) goto LAB_008c41fb;
                    }
                    (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).components[0] =
                         *(float *)local_a18.hit;
                    (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_a18.hit + 4);
                    (((Vec3f *)((long)local_a18.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_a18.hit + 8);
                    *(float *)((long)local_a18.ray + 0x3c) = *(float *)(local_a18.hit + 0xc);
                    *(float *)((long)local_a18.ray + 0x40) = *(float *)(local_a18.hit + 0x10);
                    *(float *)((long)local_a18.ray + 0x44) = *(float *)(local_a18.hit + 0x14);
                    *(float *)((long)local_a18.ray + 0x48) = *(float *)(local_a18.hit + 0x18);
                    *(float *)((long)local_a18.ray + 0x4c) = *(float *)(local_a18.hit + 0x1c);
                    *(float *)((long)local_a18.ray + 0x50) = *(float *)(local_a18.hit + 0x20);
                  }
                  else {
                    auVar268 = ZEXT1664(auVar20);
                    auVar320 = ZEXT1664(auVar126);
                    auVar345 = ZEXT1664(auVar345._0_16_);
                    auVar363 = ZEXT1664(auVar363._0_16_);
                    (*pGVar12->intersectionFilterN)(&local_a18);
                    if (*local_a18.valid != 0) goto LAB_008c415b;
LAB_008c41fb:
                    (ray->super_RayK<1>).tfar = fVar322;
                  }
                }
              }
            }
          }
LAB_008c403f:
          fVar315 = (ray->super_RayK<1>).tfar;
          auVar139._4_4_ = fVar315;
          auVar139._0_4_ = fVar315;
          auVar139._8_4_ = fVar315;
          auVar139._12_4_ = fVar315;
          auVar139._16_4_ = fVar315;
          auVar139._20_4_ = fVar315;
          auVar139._24_4_ = fVar315;
          auVar139._28_4_ = fVar315;
          auVar105 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
          auVar129 = vcmpps_avx(_local_7a0,auVar139,2);
          auVar129 = vandps_avx(auVar129,local_700);
        }
        auVar129 = vandps_avx(local_680,local_660);
        auVar25 = vandps_avx(local_7e0,_local_7c0);
        auVar206._0_4_ = local_800._0_4_ + local_5a0._0_4_;
        auVar206._4_4_ = local_800._4_4_ + local_5a0._4_4_;
        auVar206._8_4_ = local_800._8_4_ + local_5a0._8_4_;
        auVar206._12_4_ = local_800._12_4_ + local_5a0._12_4_;
        auVar206._16_4_ = local_800._16_4_ + local_5a0._16_4_;
        auVar206._20_4_ = local_800._20_4_ + local_5a0._20_4_;
        auVar206._24_4_ = local_800._24_4_ + local_5a0._24_4_;
        auVar206._28_4_ = local_800._28_4_ + local_5a0._28_4_;
        auVar176 = vshufps_avx(auVar105._0_16_,auVar105._0_16_,0);
        auVar226._16_16_ = auVar176;
        auVar226._0_16_ = auVar176;
        auVar105 = vcmpps_avx(auVar206,auVar226,2);
        auVar105 = vandps_avx(auVar105,auVar129);
        auVar207._0_4_ = local_800._0_4_ + local_5e0._0_4_;
        auVar207._4_4_ = local_800._4_4_ + local_5e0._4_4_;
        auVar207._8_4_ = local_800._8_4_ + local_5e0._8_4_;
        auVar207._12_4_ = local_800._12_4_ + local_5e0._12_4_;
        auVar207._16_4_ = local_800._16_4_ + local_5e0._16_4_;
        auVar207._20_4_ = local_800._20_4_ + local_5e0._20_4_;
        auVar207._24_4_ = local_800._24_4_ + local_5e0._24_4_;
        auVar207._28_4_ = local_800._28_4_ + local_5e0._28_4_;
        auVar129 = vcmpps_avx(auVar207,auVar226,2);
        auVar129 = vandps_avx(auVar129,auVar25);
        auVar129 = vorps_avx(auVar105,auVar129);
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0x7f,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar129 >> 0xbf,0) != '\0') ||
            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar129[0x1f] < '\0') {
          uVar84 = (ulong)uVar85;
          *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar129;
          auVar105 = vblendvps_avx(_local_5e0,local_5a0,auVar105);
          *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar105;
          uVar83 = vmovlps_avx(local_5f0);
          (&uStack_140)[uVar84 * 0xc] = uVar83;
          auStack_138[uVar84 * 0x18] = local_b1c + 1;
          uVar85 = uVar85 + 1;
        }
      }
    }
    auVar244 = ZEXT3264(local_800);
    fVar315 = (ray->super_RayK<1>).tfar;
    auVar157._4_4_ = fVar315;
    auVar157._0_4_ = fVar315;
    auVar157._8_4_ = fVar315;
    auVar157._12_4_ = fVar315;
    auVar157._16_4_ = fVar315;
    auVar157._20_4_ = fVar315;
    auVar157._24_4_ = fVar315;
    auVar157._28_4_ = fVar315;
    do {
      uVar87 = uVar85;
      if (uVar87 == 0) {
        auVar104 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
        auVar104 = vshufps_avx(auVar104,auVar104,0);
        auVar104 = vcmpps_avx(local_600,auVar104,2);
        uVar86 = vmovmskps_avx(auVar104);
        uVar82 = (ulong)((uint)uVar82 - 1 & (uint)uVar82 & uVar86);
        goto LAB_008c19d8;
      }
      uVar83 = (ulong)(uVar87 - 1);
      lVar89 = uVar83 * 0x60;
      auVar105 = *(undefined1 (*) [32])(auStack_160 + lVar89);
      auVar133._0_4_ = local_800._0_4_ + auVar105._0_4_;
      auVar133._4_4_ = local_800._4_4_ + auVar105._4_4_;
      auVar133._8_4_ = local_800._8_4_ + auVar105._8_4_;
      auVar133._12_4_ = local_800._12_4_ + auVar105._12_4_;
      auVar133._16_4_ = local_800._16_4_ + auVar105._16_4_;
      auVar133._20_4_ = local_800._20_4_ + auVar105._20_4_;
      auVar133._24_4_ = local_800._24_4_ + auVar105._24_4_;
      auVar133._28_4_ = local_800._28_4_ + auVar105._28_4_;
      auVar25 = vcmpps_avx(auVar133,auVar157,2);
      auVar228 = ZEXT3264(auVar25);
      auVar129 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar89));
      local_5a0 = auVar129;
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar89) & auVar25;
      uVar85 = uVar87 - 1;
    } while ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar25 >> 0x7f,0) == '\0') &&
               (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar25 >> 0xbf,0) == '\0') &&
             (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar25[0x1f]);
    auVar109._8_4_ = 0x7f800000;
    auVar109._0_8_ = 0x7f8000007f800000;
    auVar109._12_4_ = 0x7f800000;
    auVar109._16_4_ = 0x7f800000;
    auVar109._20_4_ = 0x7f800000;
    auVar109._24_4_ = 0x7f800000;
    auVar109._28_4_ = 0x7f800000;
    auVar105 = vblendvps_avx(auVar109,auVar105,auVar129);
    auVar25 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar25 = vminps_avx(auVar105,auVar25);
    auVar23 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar23);
    auVar23 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar23);
    auVar105 = vcmpps_avx(auVar105,auVar25,0);
    auVar25 = auVar129 & auVar105;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar129 = vandps_avx(auVar105,auVar129);
    }
    auVar93._8_8_ = 0;
    auVar93._0_8_ = (&uStack_140)[uVar83 * 0xc];
    local_b1c = auStack_138[uVar83 * 0x18];
    uVar85 = vmovmskps_avx(auVar129);
    uVar81 = 0;
    if (uVar85 != 0) {
      for (; (uVar85 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
      }
    }
    *(undefined4 *)(local_5a0 + (ulong)uVar81 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar89) = local_5a0;
    uVar85 = uVar87 - 1;
    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5a0 >> 0x7f,0) != '\0') ||
          (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5a0 >> 0xbf,0) != '\0') ||
        (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5a0[0x1f] < '\0') {
      uVar85 = uVar87;
    }
    auVar176 = vshufps_avx(auVar93,auVar93,0);
    auVar20 = vshufps_avx(auVar93,auVar93,0x55);
    auVar20 = vsubps_avx(auVar20,auVar176);
    local_5e0._4_4_ = auVar176._4_4_ + auVar20._4_4_ * 0.14285715;
    local_5e0._0_4_ = auVar176._0_4_ + auVar20._0_4_ * 0.0;
    fStack_5d8 = auVar176._8_4_ + auVar20._8_4_ * 0.2857143;
    fStack_5d4 = auVar176._12_4_ + auVar20._12_4_ * 0.42857146;
    fStack_5d0 = auVar176._0_4_ + auVar20._0_4_ * 0.5714286;
    fStack_5cc = auVar176._4_4_ + auVar20._4_4_ * 0.71428573;
    fStack_5c8 = auVar176._8_4_ + auVar20._8_4_ * 0.8571429;
    fStack_5c4 = auVar176._12_4_ + auVar20._12_4_;
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_5e0 + (ulong)uVar81 * 4);
    uVar83 = local_8e0._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }